

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiMBIntersectorK<8,4>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx512::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  undefined1 auVar2 [16];
  Primitive PVar3;
  Geometry *pGVar4;
  __int_type_conflict _Var5;
  long lVar6;
  long lVar7;
  RTCFilterFunctionN p_Var8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined8 uVar16;
  ulong uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  int iVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [12];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  byte bVar72;
  byte bVar73;
  byte bVar74;
  long lVar75;
  byte bVar76;
  uint uVar77;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  byte bVar78;
  bool bVar79;
  long lVar80;
  bool bVar81;
  ulong uVar82;
  ulong uVar83;
  uint uVar84;
  undefined1 auVar94 [16];
  uint uVar85;
  uint uVar136;
  uint uVar137;
  uint uVar139;
  uint uVar140;
  uint uVar141;
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  uint uVar138;
  uint uVar142;
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  float pp;
  float fVar143;
  float fVar144;
  float fVar159;
  float fVar160;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined4 uVar166;
  undefined1 auVar167 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar168 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [64];
  float fVar185;
  float fVar210;
  float fVar211;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [32];
  float fVar212;
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  float fVar213;
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar231;
  float fVar232;
  undefined1 auVar222 [16];
  float fVar233;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar234 [16];
  float fVar237;
  undefined1 auVar235 [32];
  undefined1 auVar236 [64];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [64];
  float fVar243;
  undefined1 auVar244 [32];
  float fVar246;
  float fVar247;
  float fVar248;
  undefined1 auVar245 [64];
  undefined1 auVar249 [64];
  undefined1 auVar250 [28];
  float fVar251;
  undefined1 auVar252 [64];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [32];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [64];
  undefined1 auVar262 [64];
  undefined1 auVar263 [64];
  undefined1 auVar264 [64];
  undefined1 auVar265 [64];
  undefined1 auVar266 [64];
  undefined1 auVar267 [64];
  undefined1 auVar268 [64];
  undefined1 auVar269 [64];
  undefined1 auVar270 [64];
  undefined1 auVar271 [64];
  undefined1 auVar272 [64];
  undefined1 auVar273 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  StackEntry stack [3];
  undefined1 local_9e0 [16];
  uint local_9d0;
  int local_9cc;
  float local_9c8;
  float local_9c4;
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  undefined1 local_7a0 [32];
  undefined1 local_770 [16];
  ulong local_758;
  RTCFilterFunctionNArguments local_750;
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [16];
  undefined1 local_6b0 [16];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_610 [16];
  undefined1 local_600 [16];
  float local_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [16];
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [16];
  Primitive *local_5b0;
  ulong local_5a8;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  undefined1 auStack_550 [16];
  undefined1 local_540 [32];
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  RTCHitN local_4e0 [16];
  undefined1 auStack_4d0 [16];
  undefined4 local_4c0;
  undefined4 uStack_4bc;
  undefined4 uStack_4b8;
  undefined4 uStack_4b4;
  float local_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [16];
  undefined8 local_490;
  undefined8 uStack_488;
  undefined1 local_480 [16];
  uint local_470;
  uint uStack_46c;
  uint uStack_468;
  uint uStack_464;
  uint uStack_460;
  uint uStack_45c;
  uint uStack_458;
  uint uStack_454;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_390 [16];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  byte abStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 auVar257 [64];
  
  PVar3 = prim[1];
  uVar83 = (ulong)(byte)PVar3;
  lVar75 = uVar83 * 0x25;
  fVar243 = *(float *)(prim + lVar75 + 0x12);
  auVar86 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar86 = vinsertps_avx(auVar86,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar88 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar91 = vinsertps_avx(auVar88,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar145 = vsubps_avx(auVar86,*(undefined1 (*) [16])(prim + lVar75 + 6));
  fVar213 = fVar243 * auVar145._0_4_;
  fVar143 = fVar243 * auVar91._0_4_;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar83 * 4 + 6);
  auVar99 = vpmovsxbd_avx2(auVar86);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar83 * 5 + 6);
  auVar98 = vpmovsxbd_avx2(auVar88);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar83 * 6 + 6);
  auVar100 = vpmovsxbd_avx2(auVar89);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *(ulong *)(prim + uVar83 * 0xf + 6);
  auVar101 = vpmovsxbd_avx2(auVar93);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar107 = vpmovsxbd_avx2(auVar2);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar102 = vcvtdq2ps_avx(auVar107);
  auVar223._8_8_ = 0;
  auVar223._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar83 + 6);
  auVar103 = vpmovsxbd_avx2(auVar223);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar83 * 0x1a + 6);
  auVar104 = vpmovsxbd_avx2(auVar90);
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar83 * 0x1b + 6);
  auVar105 = vpmovsxbd_avx2(auVar87);
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *(ulong *)(prim + uVar83 * 0x1c + 6);
  auVar97 = vpmovsxbd_avx2(auVar92);
  auVar106 = vcvtdq2ps_avx(auVar97);
  auVar114._4_4_ = fVar143;
  auVar114._0_4_ = fVar143;
  auVar114._8_4_ = fVar143;
  auVar114._12_4_ = fVar143;
  auVar114._16_4_ = fVar143;
  auVar114._20_4_ = fVar143;
  auVar114._24_4_ = fVar143;
  auVar114._28_4_ = fVar143;
  auVar120._8_4_ = 1;
  auVar120._0_8_ = 0x100000001;
  auVar120._12_4_ = 1;
  auVar120._16_4_ = 1;
  auVar120._20_4_ = 1;
  auVar120._24_4_ = 1;
  auVar120._28_4_ = 1;
  auVar95 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar109 = ZEXT1632(CONCAT412(fVar243 * auVar91._12_4_,
                                CONCAT48(fVar243 * auVar91._8_4_,
                                         CONCAT44(fVar243 * auVar91._4_4_,fVar143))));
  auVar108 = vpermps_avx2(auVar120,auVar109);
  auVar96 = vpermps_avx512vl(auVar95,auVar109);
  fVar246 = auVar96._0_4_;
  fVar247 = auVar96._4_4_;
  auVar109._4_4_ = fVar247 * auVar100._4_4_;
  auVar109._0_4_ = fVar246 * auVar100._0_4_;
  fVar248 = auVar96._8_4_;
  auVar109._8_4_ = fVar248 * auVar100._8_4_;
  fVar219 = auVar96._12_4_;
  auVar109._12_4_ = fVar219 * auVar100._12_4_;
  fVar220 = auVar96._16_4_;
  auVar109._16_4_ = fVar220 * auVar100._16_4_;
  fVar221 = auVar96._20_4_;
  auVar109._20_4_ = fVar221 * auVar100._20_4_;
  fVar164 = auVar96._24_4_;
  auVar109._24_4_ = fVar164 * auVar100._24_4_;
  auVar109._28_4_ = auVar107._28_4_;
  auVar107._4_4_ = auVar103._4_4_ * fVar247;
  auVar107._0_4_ = auVar103._0_4_ * fVar246;
  auVar107._8_4_ = auVar103._8_4_ * fVar248;
  auVar107._12_4_ = auVar103._12_4_ * fVar219;
  auVar107._16_4_ = auVar103._16_4_ * fVar220;
  auVar107._20_4_ = auVar103._20_4_ * fVar221;
  auVar107._24_4_ = auVar103._24_4_ * fVar164;
  auVar107._28_4_ = auVar97._28_4_;
  auVar97._4_4_ = auVar106._4_4_ * fVar247;
  auVar97._0_4_ = auVar106._0_4_ * fVar246;
  auVar97._8_4_ = auVar106._8_4_ * fVar248;
  auVar97._12_4_ = auVar106._12_4_ * fVar219;
  auVar97._16_4_ = auVar106._16_4_ * fVar220;
  auVar97._20_4_ = auVar106._20_4_ * fVar221;
  auVar97._24_4_ = auVar106._24_4_ * fVar164;
  auVar97._28_4_ = auVar96._28_4_;
  auVar86 = vfmadd231ps_fma(auVar109,auVar108,auVar98);
  auVar88 = vfmadd231ps_fma(auVar107,auVar108,auVar102);
  auVar89 = vfmadd231ps_fma(auVar97,auVar105,auVar108);
  auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar114,auVar99);
  auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar114,auVar101);
  auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar104,auVar114);
  auVar119._4_4_ = fVar213;
  auVar119._0_4_ = fVar213;
  auVar119._8_4_ = fVar213;
  auVar119._12_4_ = fVar213;
  auVar119._16_4_ = fVar213;
  auVar119._20_4_ = fVar213;
  auVar119._24_4_ = fVar213;
  auVar119._28_4_ = fVar213;
  auVar97 = ZEXT1632(CONCAT412(fVar243 * auVar145._12_4_,
                               CONCAT48(fVar243 * auVar145._8_4_,
                                        CONCAT44(fVar243 * auVar145._4_4_,fVar213))));
  auVar107 = vpermps_avx2(auVar120,auVar97);
  auVar97 = vpermps_avx512vl(auVar95,auVar97);
  fVar243 = auVar97._0_4_;
  fVar246 = auVar97._4_4_;
  auVar108._4_4_ = fVar246 * auVar100._4_4_;
  auVar108._0_4_ = fVar243 * auVar100._0_4_;
  fVar247 = auVar97._8_4_;
  auVar108._8_4_ = fVar247 * auVar100._8_4_;
  fVar248 = auVar97._12_4_;
  auVar108._12_4_ = fVar248 * auVar100._12_4_;
  fVar219 = auVar97._16_4_;
  auVar108._16_4_ = fVar219 * auVar100._16_4_;
  fVar220 = auVar97._20_4_;
  auVar108._20_4_ = fVar220 * auVar100._20_4_;
  fVar221 = auVar97._24_4_;
  auVar108._24_4_ = fVar221 * auVar100._24_4_;
  auVar108._28_4_ = fVar143;
  auVar95._4_4_ = auVar103._4_4_ * fVar246;
  auVar95._0_4_ = auVar103._0_4_ * fVar243;
  auVar95._8_4_ = auVar103._8_4_ * fVar247;
  auVar95._12_4_ = auVar103._12_4_ * fVar248;
  auVar95._16_4_ = auVar103._16_4_ * fVar219;
  auVar95._20_4_ = auVar103._20_4_ * fVar220;
  auVar95._24_4_ = auVar103._24_4_ * fVar221;
  auVar95._28_4_ = auVar100._28_4_;
  auVar103._4_4_ = auVar106._4_4_ * fVar246;
  auVar103._0_4_ = auVar106._0_4_ * fVar243;
  auVar103._8_4_ = auVar106._8_4_ * fVar247;
  auVar103._12_4_ = auVar106._12_4_ * fVar248;
  auVar103._16_4_ = auVar106._16_4_ * fVar219;
  auVar103._20_4_ = auVar106._20_4_ * fVar220;
  auVar103._24_4_ = auVar106._24_4_ * fVar221;
  auVar103._28_4_ = auVar97._28_4_;
  auVar93 = vfmadd231ps_fma(auVar108,auVar107,auVar98);
  auVar2 = vfmadd231ps_fma(auVar95,auVar107,auVar102);
  auVar223 = vfmadd231ps_fma(auVar103,auVar107,auVar105);
  auVar91 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar119,auVar99);
  auVar145 = vfmadd231ps_fma(ZEXT1632(auVar2),auVar119,auVar101);
  auVar116._8_4_ = 0x7fffffff;
  auVar116._0_8_ = 0x7fffffff7fffffff;
  auVar116._12_4_ = 0x7fffffff;
  auVar116._16_4_ = 0x7fffffff;
  auVar116._20_4_ = 0x7fffffff;
  auVar116._24_4_ = 0x7fffffff;
  auVar116._28_4_ = 0x7fffffff;
  auVar167 = vfmadd231ps_fma(ZEXT1632(auVar223),auVar119,auVar104);
  auVar99 = vandps_avx(ZEXT1632(auVar86),auVar116);
  auVar118._8_4_ = 0x219392ef;
  auVar118._0_8_ = 0x219392ef219392ef;
  auVar118._12_4_ = 0x219392ef;
  auVar118._16_4_ = 0x219392ef;
  auVar118._20_4_ = 0x219392ef;
  auVar118._24_4_ = 0x219392ef;
  auVar118._28_4_ = 0x219392ef;
  uVar82 = vcmpps_avx512vl(auVar99,auVar118,1);
  bVar79 = (bool)((byte)uVar82 & 1);
  auVar96._0_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar86._0_4_;
  bVar79 = (bool)((byte)(uVar82 >> 1) & 1);
  auVar96._4_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar86._4_4_;
  bVar79 = (bool)((byte)(uVar82 >> 2) & 1);
  auVar96._8_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar86._8_4_;
  bVar79 = (bool)((byte)(uVar82 >> 3) & 1);
  auVar96._12_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar86._12_4_;
  auVar96._16_4_ = (uint)((byte)(uVar82 >> 4) & 1) * 0x219392ef;
  auVar96._20_4_ = (uint)((byte)(uVar82 >> 5) & 1) * 0x219392ef;
  auVar96._24_4_ = (uint)((byte)(uVar82 >> 6) & 1) * 0x219392ef;
  auVar96._28_4_ = (uint)(byte)(uVar82 >> 7) * 0x219392ef;
  auVar99 = vandps_avx(ZEXT1632(auVar88),auVar116);
  uVar82 = vcmpps_avx512vl(auVar99,auVar118,1);
  bVar79 = (bool)((byte)uVar82 & 1);
  auVar110._0_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar88._0_4_;
  bVar79 = (bool)((byte)(uVar82 >> 1) & 1);
  auVar110._4_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar88._4_4_;
  bVar79 = (bool)((byte)(uVar82 >> 2) & 1);
  auVar110._8_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar88._8_4_;
  bVar79 = (bool)((byte)(uVar82 >> 3) & 1);
  auVar110._12_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar88._12_4_;
  auVar110._16_4_ = (uint)((byte)(uVar82 >> 4) & 1) * 0x219392ef;
  auVar110._20_4_ = (uint)((byte)(uVar82 >> 5) & 1) * 0x219392ef;
  auVar110._24_4_ = (uint)((byte)(uVar82 >> 6) & 1) * 0x219392ef;
  auVar110._28_4_ = (uint)(byte)(uVar82 >> 7) * 0x219392ef;
  auVar99 = vandps_avx(ZEXT1632(auVar89),auVar116);
  uVar82 = vcmpps_avx512vl(auVar99,auVar118,1);
  bVar79 = (bool)((byte)uVar82 & 1);
  auVar99._0_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar89._0_4_;
  bVar79 = (bool)((byte)(uVar82 >> 1) & 1);
  auVar99._4_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar89._4_4_;
  bVar79 = (bool)((byte)(uVar82 >> 2) & 1);
  auVar99._8_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar89._8_4_;
  bVar79 = (bool)((byte)(uVar82 >> 3) & 1);
  auVar99._12_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar89._12_4_;
  auVar99._16_4_ = (uint)((byte)(uVar82 >> 4) & 1) * 0x219392ef;
  auVar99._20_4_ = (uint)((byte)(uVar82 >> 5) & 1) * 0x219392ef;
  auVar99._24_4_ = (uint)((byte)(uVar82 >> 6) & 1) * 0x219392ef;
  auVar99._28_4_ = (uint)(byte)(uVar82 >> 7) * 0x219392ef;
  auVar98 = vrcp14ps_avx512vl(auVar96);
  auVar117._8_4_ = 0x3f800000;
  auVar117._0_8_ = 0x3f8000003f800000;
  auVar117._12_4_ = 0x3f800000;
  auVar117._16_4_ = 0x3f800000;
  auVar117._20_4_ = 0x3f800000;
  auVar117._24_4_ = 0x3f800000;
  auVar117._28_4_ = 0x3f800000;
  auVar86 = vfnmadd213ps_fma(auVar96,auVar98,auVar117);
  auVar86 = vfmadd132ps_fma(ZEXT1632(auVar86),auVar98,auVar98);
  auVar98 = vrcp14ps_avx512vl(auVar110);
  auVar88 = vfnmadd213ps_fma(auVar110,auVar98,auVar117);
  auVar88 = vfmadd132ps_fma(ZEXT1632(auVar88),auVar98,auVar98);
  auVar98 = vrcp14ps_avx512vl(auVar99);
  auVar89 = vfnmadd213ps_fma(auVar99,auVar98,auVar117);
  auVar89 = vfmadd132ps_fma(ZEXT1632(auVar89),auVar98,auVar98);
  fVar243 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar75 + 0x16)) *
            *(float *)(prim + lVar75 + 0x1a);
  auVar115._4_4_ = fVar243;
  auVar115._0_4_ = fVar243;
  auVar115._8_4_ = fVar243;
  auVar115._12_4_ = fVar243;
  auVar115._16_4_ = fVar243;
  auVar115._20_4_ = fVar243;
  auVar115._24_4_ = fVar243;
  auVar115._28_4_ = fVar243;
  auVar99 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar83 * 7 + 6));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar83 * 0xb + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,auVar99);
  auVar100 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar83 * 9 + 6));
  auVar93 = vfmadd213ps_fma(auVar98,auVar115,auVar99);
  auVar99 = vcvtdq2ps_avx(auVar100);
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar83 * 0xd + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,auVar99);
  auVar2 = vfmadd213ps_fma(auVar98,auVar115,auVar99);
  auVar99 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar83 * 0x12 + 6));
  auVar99 = vcvtdq2ps_avx(auVar99);
  uVar82 = (ulong)(uint)((int)(uVar83 * 5) << 2);
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar83 * 2 + uVar82 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,auVar99);
  auVar223 = vfmadd213ps_fma(auVar98,auVar115,auVar99);
  auVar99 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar82 + 6));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar83 * 0x18 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,auVar99);
  auVar90 = vfmadd213ps_fma(auVar98,auVar115,auVar99);
  auVar99 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar83 * 0x1d + 6));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar83 + (ulong)(byte)PVar3 * 0x20 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,auVar99);
  auVar87 = vfmadd213ps_fma(auVar98,auVar115,auVar99);
  auVar99 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + ((ulong)(byte)PVar3 * 0x20 - uVar83) + 6));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar83 * 0x23 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,auVar99);
  auVar92 = vfmadd213ps_fma(auVar98,auVar115,auVar99);
  auVar99 = vsubps_avx(ZEXT1632(auVar93),ZEXT1632(auVar91));
  auVar104._4_4_ = auVar86._4_4_ * auVar99._4_4_;
  auVar104._0_4_ = auVar86._0_4_ * auVar99._0_4_;
  auVar104._8_4_ = auVar86._8_4_ * auVar99._8_4_;
  auVar104._12_4_ = auVar86._12_4_ * auVar99._12_4_;
  auVar104._16_4_ = auVar99._16_4_ * 0.0;
  auVar104._20_4_ = auVar99._20_4_ * 0.0;
  auVar104._24_4_ = auVar99._24_4_ * 0.0;
  auVar104._28_4_ = auVar99._28_4_;
  auVar99 = vsubps_avx(ZEXT1632(auVar2),ZEXT1632(auVar91));
  auVar113._0_4_ = auVar86._0_4_ * auVar99._0_4_;
  auVar113._4_4_ = auVar86._4_4_ * auVar99._4_4_;
  auVar113._8_4_ = auVar86._8_4_ * auVar99._8_4_;
  auVar113._12_4_ = auVar86._12_4_ * auVar99._12_4_;
  auVar113._16_4_ = auVar99._16_4_ * 0.0;
  auVar113._20_4_ = auVar99._20_4_ * 0.0;
  auVar113._24_4_ = auVar99._24_4_ * 0.0;
  auVar113._28_4_ = 0;
  auVar99 = vsubps_avx(ZEXT1632(auVar223),ZEXT1632(auVar145));
  auVar105._4_4_ = auVar88._4_4_ * auVar99._4_4_;
  auVar105._0_4_ = auVar88._0_4_ * auVar99._0_4_;
  auVar105._8_4_ = auVar88._8_4_ * auVar99._8_4_;
  auVar105._12_4_ = auVar88._12_4_ * auVar99._12_4_;
  auVar105._16_4_ = auVar99._16_4_ * 0.0;
  auVar105._20_4_ = auVar99._20_4_ * 0.0;
  auVar105._24_4_ = auVar99._24_4_ * 0.0;
  auVar105._28_4_ = auVar99._28_4_;
  auVar99 = vsubps_avx(ZEXT1632(auVar90),ZEXT1632(auVar145));
  auVar112._0_4_ = auVar88._0_4_ * auVar99._0_4_;
  auVar112._4_4_ = auVar88._4_4_ * auVar99._4_4_;
  auVar112._8_4_ = auVar88._8_4_ * auVar99._8_4_;
  auVar112._12_4_ = auVar88._12_4_ * auVar99._12_4_;
  auVar112._16_4_ = auVar99._16_4_ * 0.0;
  auVar112._20_4_ = auVar99._20_4_ * 0.0;
  auVar112._24_4_ = auVar99._24_4_ * 0.0;
  auVar112._28_4_ = 0;
  auVar99 = vsubps_avx(ZEXT1632(auVar87),ZEXT1632(auVar167));
  auVar106._4_4_ = auVar89._4_4_ * auVar99._4_4_;
  auVar106._0_4_ = auVar89._0_4_ * auVar99._0_4_;
  auVar106._8_4_ = auVar89._8_4_ * auVar99._8_4_;
  auVar106._12_4_ = auVar89._12_4_ * auVar99._12_4_;
  auVar106._16_4_ = auVar99._16_4_ * 0.0;
  auVar106._20_4_ = auVar99._20_4_ * 0.0;
  auVar106._24_4_ = auVar99._24_4_ * 0.0;
  auVar106._28_4_ = auVar99._28_4_;
  auVar99 = vsubps_avx(ZEXT1632(auVar92),ZEXT1632(auVar167));
  auVar111._0_4_ = auVar89._0_4_ * auVar99._0_4_;
  auVar111._4_4_ = auVar89._4_4_ * auVar99._4_4_;
  auVar111._8_4_ = auVar89._8_4_ * auVar99._8_4_;
  auVar111._12_4_ = auVar89._12_4_ * auVar99._12_4_;
  auVar111._16_4_ = auVar99._16_4_ * 0.0;
  auVar111._20_4_ = auVar99._20_4_ * 0.0;
  auVar111._24_4_ = auVar99._24_4_ * 0.0;
  auVar111._28_4_ = 0;
  auVar99 = vpminsd_avx2(auVar104,auVar113);
  auVar98 = vpminsd_avx2(auVar105,auVar112);
  auVar99 = vmaxps_avx(auVar99,auVar98);
  auVar98 = vpminsd_avx2(auVar106,auVar111);
  uVar166 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar100._4_4_ = uVar166;
  auVar100._0_4_ = uVar166;
  auVar100._8_4_ = uVar166;
  auVar100._12_4_ = uVar166;
  auVar100._16_4_ = uVar166;
  auVar100._20_4_ = uVar166;
  auVar100._24_4_ = uVar166;
  auVar100._28_4_ = uVar166;
  auVar98 = vmaxps_avx512vl(auVar98,auVar100);
  auVar99 = vmaxps_avx(auVar99,auVar98);
  auVar98._8_4_ = 0x3f7ffffa;
  auVar98._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar98._12_4_ = 0x3f7ffffa;
  auVar98._16_4_ = 0x3f7ffffa;
  auVar98._20_4_ = 0x3f7ffffa;
  auVar98._24_4_ = 0x3f7ffffa;
  auVar98._28_4_ = 0x3f7ffffa;
  local_2e0 = vmulps_avx512vl(auVar99,auVar98);
  auVar99 = vpmaxsd_avx2(auVar104,auVar113);
  auVar98 = vpmaxsd_avx2(auVar105,auVar112);
  auVar99 = vminps_avx(auVar99,auVar98);
  auVar98 = vpmaxsd_avx2(auVar106,auVar111);
  uVar166 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar101._4_4_ = uVar166;
  auVar101._0_4_ = uVar166;
  auVar101._8_4_ = uVar166;
  auVar101._12_4_ = uVar166;
  auVar101._16_4_ = uVar166;
  auVar101._20_4_ = uVar166;
  auVar101._24_4_ = uVar166;
  auVar101._28_4_ = uVar166;
  auVar98 = vminps_avx512vl(auVar98,auVar101);
  auVar99 = vminps_avx(auVar99,auVar98);
  auVar102._8_4_ = 0x3f800003;
  auVar102._0_8_ = 0x3f8000033f800003;
  auVar102._12_4_ = 0x3f800003;
  auVar102._16_4_ = 0x3f800003;
  auVar102._20_4_ = 0x3f800003;
  auVar102._24_4_ = 0x3f800003;
  auVar102._28_4_ = 0x3f800003;
  auVar99 = vmulps_avx512vl(auVar99,auVar102);
  auVar98 = vpbroadcastd_avx512vl();
  uVar18 = vpcmpgtd_avx512vl(auVar98,_DAT_01fe9900);
  uVar16 = vcmpps_avx512vl(local_2e0,auVar99,2);
  if ((byte)((byte)uVar16 & (byte)uVar18) == 0) {
    return false;
  }
  local_5a8 = (ulong)(byte)((byte)uVar16 & (byte)uVar18);
  local_510 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_5b0 = prim;
LAB_01dfad2a:
  lVar75 = 0;
  for (uVar82 = local_5a8; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x8000000000000000) {
    lVar75 = lVar75 + 1;
  }
  local_758 = (ulong)*(uint *)(local_5b0 + 2);
  pGVar4 = (context->scene->geometries).items[local_758].ptr;
  uVar82 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           (ulong)*(uint *)(local_5b0 + lVar75 * 4 + 6) *
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar243 = (pGVar4->time_range).lower;
  fVar243 = pGVar4->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar243) / ((pGVar4->time_range).upper - fVar243));
  auVar86 = vroundss_avx(ZEXT416((uint)fVar243),ZEXT416((uint)fVar243),9);
  auVar86 = vminss_avx(auVar86,ZEXT416((uint)(pGVar4->fnumTimeSegments + -1.0)));
  auVar86 = vmaxss_avx(ZEXT816(0) << 0x20,auVar86);
  fVar243 = fVar243 - auVar86._0_4_;
  _Var5 = pGVar4[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar80 = (long)(int)auVar86._0_4_ * 0x38;
  lVar75 = *(long *)(_Var5 + 0x10 + lVar80);
  lVar6 = *(long *)(_Var5 + 0x38 + lVar80);
  lVar7 = *(long *)(_Var5 + 0x48 + lVar80);
  pfVar1 = (float *)(lVar6 + uVar82 * lVar7);
  auVar145._0_4_ = fVar243 * *pfVar1;
  auVar145._4_4_ = fVar243 * pfVar1[1];
  auVar145._8_4_ = fVar243 * pfVar1[2];
  auVar145._12_4_ = fVar243 * pfVar1[3];
  pfVar1 = (float *)(lVar6 + (uVar82 + 1) * lVar7);
  auVar167._0_4_ = fVar243 * *pfVar1;
  auVar167._4_4_ = fVar243 * pfVar1[1];
  auVar167._8_4_ = fVar243 * pfVar1[2];
  auVar167._12_4_ = fVar243 * pfVar1[3];
  pfVar1 = (float *)(lVar6 + (uVar82 + 2) * lVar7);
  auVar186._0_4_ = fVar243 * *pfVar1;
  auVar186._4_4_ = fVar243 * pfVar1[1];
  auVar186._8_4_ = fVar243 * pfVar1[2];
  auVar186._12_4_ = fVar243 * pfVar1[3];
  pfVar1 = (float *)(lVar6 + lVar7 * (uVar82 + 3));
  auVar214._0_4_ = fVar243 * *pfVar1;
  auVar214._4_4_ = fVar243 * pfVar1[1];
  auVar214._8_4_ = fVar243 * pfVar1[2];
  auVar214._12_4_ = fVar243 * pfVar1[3];
  lVar6 = *(long *)(_Var5 + lVar80);
  fVar243 = 1.0 - fVar243;
  auVar222._4_4_ = fVar243;
  auVar222._0_4_ = fVar243;
  auVar222._8_4_ = fVar243;
  auVar222._12_4_ = fVar243;
  auVar89 = vfmadd231ps_fma(auVar145,auVar222,*(undefined1 (*) [16])(lVar6 + lVar75 * uVar82));
  auVar93 = vfmadd231ps_fma(auVar167,auVar222,*(undefined1 (*) [16])(lVar6 + lVar75 * (uVar82 + 1)))
  ;
  auVar2 = vfmadd231ps_fma(auVar186,auVar222,*(undefined1 (*) [16])(lVar6 + lVar75 * (uVar82 + 2)));
  auVar223 = vfmadd231ps_fma(auVar214,auVar222,*(undefined1 (*) [16])(lVar6 + lVar75 * (uVar82 + 3))
                            );
  auVar86 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar88 = vinsertps_avx(auVar86,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  uVar166 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar253._4_4_ = uVar166;
  auVar253._0_4_ = uVar166;
  auVar253._8_4_ = uVar166;
  auVar253._12_4_ = uVar166;
  local_400._16_4_ = uVar166;
  local_400._0_16_ = auVar253;
  local_400._20_4_ = uVar166;
  local_400._24_4_ = uVar166;
  local_400._28_4_ = uVar166;
  auVar257 = ZEXT3264(local_400);
  uVar166 = *(undefined4 *)(ray + k * 4 + 0x50);
  auVar258._4_4_ = uVar166;
  auVar258._0_4_ = uVar166;
  auVar258._8_4_ = uVar166;
  auVar258._12_4_ = uVar166;
  local_420._16_4_ = uVar166;
  local_420._0_16_ = auVar258;
  local_420._20_4_ = uVar166;
  local_420._24_4_ = uVar166;
  local_420._28_4_ = uVar166;
  auVar86 = vunpcklps_avx(auVar253,auVar258);
  fVar243 = *(float *)(ray + k * 4 + 0x60);
  auVar259._4_4_ = fVar243;
  auVar259._0_4_ = fVar243;
  auVar259._8_4_ = fVar243;
  auVar259._12_4_ = fVar243;
  local_440._16_4_ = fVar243;
  local_440._0_16_ = auVar259;
  local_440._20_4_ = fVar243;
  local_440._24_4_ = fVar243;
  local_440._28_4_ = fVar243;
  local_6b0 = vinsertps_avx(auVar86,auVar259,0x28);
  auVar249 = ZEXT1664(local_6b0);
  auVar234._0_4_ = auVar89._0_4_ + auVar93._0_4_ + auVar2._0_4_ + auVar223._0_4_;
  auVar234._4_4_ = auVar89._4_4_ + auVar93._4_4_ + auVar2._4_4_ + auVar223._4_4_;
  auVar234._8_4_ = auVar89._8_4_ + auVar93._8_4_ + auVar2._8_4_ + auVar223._8_4_;
  auVar234._12_4_ = auVar89._12_4_ + auVar93._12_4_ + auVar2._12_4_ + auVar223._12_4_;
  auVar91._8_4_ = 0x3e800000;
  auVar91._0_8_ = 0x3e8000003e800000;
  auVar91._12_4_ = 0x3e800000;
  auVar86 = vmulps_avx512vl(auVar234,auVar91);
  auVar86 = vsubps_avx(auVar86,auVar88);
  auVar86 = vdpps_avx(auVar86,local_6b0,0x7f);
  fVar143 = *(float *)(ray + k * 4 + 0x30);
  local_6c0 = vdpps_avx(local_6b0,local_6b0,0x7f);
  auVar252 = ZEXT1664(local_6c0);
  local_4f0 = vpbroadcastd_avx512vl();
  auVar238._4_12_ = ZEXT812(0) << 0x20;
  auVar238._0_4_ = local_6c0._0_4_;
  auVar87 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar238);
  auVar90 = vfnmadd213ss_fma(auVar87,local_6c0,ZEXT416(0x40000000));
  local_2c0 = auVar86._0_4_ * auVar87._0_4_ * auVar90._0_4_;
  auVar239._4_4_ = local_2c0;
  auVar239._0_4_ = local_2c0;
  auVar239._8_4_ = local_2c0;
  auVar239._12_4_ = local_2c0;
  fStack_9b0 = local_2c0;
  _local_9c0 = auVar239;
  fStack_9ac = local_2c0;
  fStack_9a8 = local_2c0;
  fStack_9a4 = local_2c0;
  auVar86 = vfmadd231ps_fma(auVar88,local_6b0,auVar239);
  auVar86 = vblendps_avx(auVar86,ZEXT816(0) << 0x40,8);
  auVar88 = vsubps_avx(auVar89,auVar86);
  auVar89 = vsubps_avx(auVar2,auVar86);
  auVar242 = ZEXT1664(auVar89);
  auVar93 = vsubps_avx(auVar93,auVar86);
  auVar245 = ZEXT1664(auVar93);
  auVar86 = vsubps_avx(auVar223,auVar86);
  local_8e0 = vbroadcastss_avx512vl(auVar88);
  auVar269 = ZEXT3264(local_8e0);
  auVar124._8_4_ = 1;
  auVar124._0_8_ = 0x100000001;
  auVar124._12_4_ = 1;
  auVar124._16_4_ = 1;
  auVar124._20_4_ = 1;
  auVar124._24_4_ = 1;
  auVar124._28_4_ = 1;
  local_640 = ZEXT1632(auVar88);
  local_900 = vpermps_avx512vl(auVar124,local_640);
  auVar261 = ZEXT3264(local_900);
  auVar179._8_4_ = 2;
  auVar179._0_8_ = 0x200000002;
  auVar179._12_4_ = 2;
  auVar179._16_4_ = 2;
  auVar179._20_4_ = 2;
  auVar179._24_4_ = 2;
  auVar179._28_4_ = 2;
  local_920 = vpermps_avx512vl(auVar179,local_640);
  auVar262 = ZEXT3264(local_920);
  auVar205._8_4_ = 3;
  auVar205._0_8_ = 0x300000003;
  auVar205._12_4_ = 3;
  auVar205._16_4_ = 3;
  auVar205._20_4_ = 3;
  auVar205._24_4_ = 3;
  auVar205._28_4_ = 3;
  local_940 = vpermps_avx512vl(auVar205,local_640);
  auVar263 = ZEXT3264(local_940);
  local_800 = vbroadcastss_avx512vl(auVar93);
  auVar264 = ZEXT3264(local_800);
  local_680 = ZEXT1632(auVar93);
  local_960 = vpermps_avx512vl(auVar124,local_680);
  auVar265 = ZEXT3264(local_960);
  local_820 = vpermps_avx512vl(auVar179,local_680);
  auVar266 = ZEXT3264(local_820);
  local_980 = vpermps_avx512vl(auVar205,local_680);
  auVar267 = ZEXT3264(local_980);
  local_840 = vbroadcastss_avx512vl(auVar89);
  auVar268 = ZEXT3264(local_840);
  local_660 = ZEXT1632(auVar89);
  local_860 = vpermps_avx512vl(auVar124,local_660);
  auVar270 = ZEXT3264(local_860);
  local_880 = vpermps_avx512vl(auVar179,local_660);
  auVar271 = ZEXT3264(local_880);
  local_8c0 = vpermps_avx512vl(auVar205,local_660);
  auVar272 = ZEXT3264(local_8c0);
  local_9a0 = vbroadcastss_avx512vl(auVar86);
  auVar273 = ZEXT3264(local_9a0);
  _local_6a0 = ZEXT1632(auVar86);
  local_260 = vpermps_avx512vl(auVar124,_local_6a0);
  local_240 = vpermps_avx512vl(auVar179,_local_6a0);
  local_2a0 = vpermps_avx2(auVar205,_local_6a0);
  auVar86 = vfmadd231ps_fma(ZEXT432((uint)(fVar243 * fVar243)),local_420,local_420);
  auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),local_400,local_400);
  local_220._0_4_ = auVar86._0_4_;
  local_220._4_4_ = local_220._0_4_;
  local_220._8_4_ = local_220._0_4_;
  local_220._12_4_ = local_220._0_4_;
  local_220._16_4_ = local_220._0_4_;
  local_220._20_4_ = local_220._0_4_;
  local_220._24_4_ = local_220._0_4_;
  local_220._28_4_ = local_220._0_4_;
  auVar123._8_4_ = 0x7fffffff;
  auVar123._0_8_ = 0x7fffffff7fffffff;
  auVar123._12_4_ = 0x7fffffff;
  auVar123._16_4_ = 0x7fffffff;
  auVar123._20_4_ = 0x7fffffff;
  auVar123._24_4_ = 0x7fffffff;
  auVar123._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_220,auVar123);
  local_610 = ZEXT416((uint)local_2c0);
  local_2c0 = fVar143 - local_2c0;
  fStack_2bc = local_2c0;
  fStack_2b8 = local_2c0;
  fStack_2b4 = local_2c0;
  fStack_2b0 = local_2c0;
  fStack_2ac = local_2c0;
  fStack_2a8 = local_2c0;
  fStack_2a4 = local_2c0;
  uVar77 = 0;
  bVar79 = false;
  local_9cc = 1;
  local_500 = vpbroadcastd_avx512vl();
  auVar86 = vsqrtss_avx(local_6c0,local_6c0);
  local_9c4 = auVar86._0_4_;
  auVar86 = vsqrtss_avx(local_6c0,local_6c0);
  local_9c8 = auVar86._0_4_;
  auVar184 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar236 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 0x3f8000003f800000)
                                                                       ))))));
  local_280 = local_240;
  do {
    local_390 = auVar184._0_16_;
    auVar86 = vmovshdup_avx(local_390);
    auVar86 = vsubps_avx(auVar86,local_390);
    local_8a0._0_4_ = auVar86._0_4_;
    fVar233 = local_8a0._0_4_ * 0.04761905;
    uVar166 = auVar184._0_4_;
    auVar228._4_4_ = uVar166;
    auVar228._0_4_ = uVar166;
    auVar228._8_4_ = uVar166;
    auVar228._12_4_ = uVar166;
    auVar228._16_4_ = uVar166;
    auVar228._20_4_ = uVar166;
    auVar228._24_4_ = uVar166;
    auVar228._28_4_ = uVar166;
    local_8a0._4_4_ = local_8a0._0_4_;
    local_8a0._8_4_ = local_8a0._0_4_;
    local_8a0._12_4_ = local_8a0._0_4_;
    local_8a0._16_4_ = local_8a0._0_4_;
    local_8a0._20_4_ = local_8a0._0_4_;
    local_8a0._24_4_ = local_8a0._0_4_;
    local_8a0._28_4_ = local_8a0._0_4_;
    auVar86 = vfmadd231ps_fma(auVar228,local_8a0,_DAT_01faff20);
    auVar99 = vsubps_avx(auVar236._0_32_,ZEXT1632(auVar86));
    fVar243 = auVar99._0_4_;
    fVar247 = auVar99._4_4_;
    fVar219 = auVar99._8_4_;
    fVar221 = auVar99._12_4_;
    fVar213 = auVar99._16_4_;
    fVar231 = auVar99._20_4_;
    fVar232 = auVar99._24_4_;
    fVar144 = fVar243 * fVar243 * fVar243;
    fVar159 = fVar247 * fVar247 * fVar247;
    auVar39._4_4_ = fVar159;
    auVar39._0_4_ = fVar144;
    fVar160 = fVar219 * fVar219 * fVar219;
    auVar39._8_4_ = fVar160;
    fVar161 = fVar221 * fVar221 * fVar221;
    auVar39._12_4_ = fVar161;
    fVar162 = fVar213 * fVar213 * fVar213;
    auVar39._16_4_ = fVar162;
    fVar163 = fVar231 * fVar231 * fVar231;
    auVar39._20_4_ = fVar163;
    fVar165 = fVar232 * fVar232 * fVar232;
    auVar39._24_4_ = fVar165;
    auVar39._28_4_ = local_8a0._0_4_;
    auVar98 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar100 = vmulps_avx512vl(auVar39,auVar98);
    fVar246 = auVar86._0_4_;
    fVar248 = auVar86._4_4_;
    fVar220 = auVar86._8_4_;
    fVar164 = auVar86._12_4_;
    fVar185 = fVar246 * fVar246 * fVar246;
    fVar210 = fVar248 * fVar248 * fVar248;
    fVar211 = fVar220 * fVar220 * fVar220;
    fVar212 = fVar164 * fVar164 * fVar164;
    auVar71._28_4_ = DAT_01faff20._28_4_;
    auVar71._0_28_ = ZEXT1628(CONCAT412(fVar212,CONCAT48(fVar211,CONCAT44(fVar210,fVar185))));
    auVar184._0_4_ = fVar246 * fVar243;
    auVar184._4_4_ = fVar248 * fVar247;
    auVar184._8_4_ = fVar220 * fVar219;
    auVar184._12_4_ = fVar164 * fVar221;
    auVar184._16_4_ = fVar213 * 0.0;
    auVar184._20_4_ = fVar231 * 0.0;
    auVar184._28_36_ = auVar249._28_36_;
    auVar184._24_4_ = fVar232 * 0.0;
    auVar101 = vmulps_avx512vl(auVar71,auVar98);
    fVar251 = auVar101._28_4_ + local_8a0._0_4_;
    fVar237 = fVar251 + auVar252._28_4_ + auVar236._28_4_;
    auVar40._4_4_ = fVar159 * 0.16666667;
    auVar40._0_4_ = fVar144 * 0.16666667;
    auVar40._8_4_ = fVar160 * 0.16666667;
    auVar40._12_4_ = fVar161 * 0.16666667;
    auVar40._16_4_ = fVar162 * 0.16666667;
    auVar40._20_4_ = fVar163 * 0.16666667;
    auVar40._24_4_ = fVar165 * 0.16666667;
    auVar40._28_4_ = fVar251;
    auVar41._4_4_ =
         (auVar184._4_4_ * fVar247 * 12.0 + auVar184._4_4_ * fVar248 * 6.0 +
         fVar210 + auVar100._4_4_) * 0.16666667;
    auVar41._0_4_ =
         (auVar184._0_4_ * fVar243 * 12.0 + auVar184._0_4_ * fVar246 * 6.0 +
         fVar185 + auVar100._0_4_) * 0.16666667;
    auVar41._8_4_ =
         (auVar184._8_4_ * fVar219 * 12.0 + auVar184._8_4_ * fVar220 * 6.0 +
         fVar211 + auVar100._8_4_) * 0.16666667;
    auVar41._12_4_ =
         (auVar184._12_4_ * fVar221 * 12.0 + auVar184._12_4_ * fVar164 * 6.0 +
         fVar212 + auVar100._12_4_) * 0.16666667;
    auVar41._16_4_ =
         (auVar184._16_4_ * fVar213 * 12.0 + auVar184._16_4_ * 0.0 * 6.0 + auVar100._16_4_ + 0.0) *
         0.16666667;
    auVar41._20_4_ =
         (auVar184._20_4_ * fVar231 * 12.0 + auVar184._20_4_ * 0.0 * 6.0 + auVar100._20_4_ + 0.0) *
         0.16666667;
    auVar41._24_4_ =
         (auVar184._24_4_ * fVar232 * 12.0 + auVar184._24_4_ * 0.0 * 6.0 + auVar100._24_4_ + 0.0) *
         0.16666667;
    auVar41._28_4_ = auVar252._28_4_;
    auVar42._4_4_ =
         (auVar101._4_4_ + fVar159 +
         auVar184._4_4_ * fVar248 * 12.0 + auVar184._4_4_ * fVar247 * 6.0) * 0.16666667;
    auVar42._0_4_ =
         (auVar101._0_4_ + fVar144 +
         auVar184._0_4_ * fVar246 * 12.0 + auVar184._0_4_ * fVar243 * 6.0) * 0.16666667;
    auVar42._8_4_ =
         (auVar101._8_4_ + fVar160 +
         auVar184._8_4_ * fVar220 * 12.0 + auVar184._8_4_ * fVar219 * 6.0) * 0.16666667;
    auVar42._12_4_ =
         (auVar101._12_4_ + fVar161 +
         auVar184._12_4_ * fVar164 * 12.0 + auVar184._12_4_ * fVar221 * 6.0) * 0.16666667;
    auVar42._16_4_ =
         (auVar101._16_4_ + fVar162 + auVar184._16_4_ * 0.0 * 12.0 + auVar184._16_4_ * fVar213 * 6.0
         ) * 0.16666667;
    auVar42._20_4_ =
         (auVar101._20_4_ + fVar163 + auVar184._20_4_ * 0.0 * 12.0 + auVar184._20_4_ * fVar231 * 6.0
         ) * 0.16666667;
    auVar42._24_4_ =
         (auVar101._24_4_ + fVar165 + auVar184._24_4_ * 0.0 * 12.0 + auVar184._24_4_ * fVar232 * 6.0
         ) * 0.16666667;
    auVar42._28_4_ = auVar257._28_4_;
    auVar43._28_4_ = fVar237;
    auVar43._0_28_ =
         ZEXT1628(CONCAT412(fVar212 * 0.16666667,
                            CONCAT48(fVar211 * 0.16666667,
                                     CONCAT44(fVar210 * 0.16666667,fVar185 * 0.16666667))));
    auVar100 = vmulps_avx512vl(auVar273._0_32_,auVar43);
    auVar101 = vmulps_avx512vl(local_260,auVar43);
    auVar102 = vmulps_avx512vl(local_280,auVar43);
    auVar44._4_4_ = local_2a0._4_4_ * fVar210 * 0.16666667;
    auVar44._0_4_ = local_2a0._0_4_ * fVar185 * 0.16666667;
    auVar44._8_4_ = local_2a0._8_4_ * fVar211 * 0.16666667;
    auVar44._12_4_ = local_2a0._12_4_ * fVar212 * 0.16666667;
    auVar44._16_4_ = local_2a0._16_4_ * 0.0;
    auVar44._20_4_ = local_2a0._20_4_ * 0.0;
    auVar44._24_4_ = local_2a0._24_4_ * 0.0;
    auVar44._28_4_ = fVar237;
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar42,auVar268._0_32_);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar42,auVar270._0_32_);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar42,auVar271._0_32_);
    auVar103 = vfmadd231ps_avx512vl(auVar44,auVar272._0_32_,auVar42);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar41,auVar264._0_32_);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar41,auVar265._0_32_);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar41,auVar266._0_32_);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar267._0_32_,auVar41);
    auVar104 = vfmadd231ps_avx512vl(auVar100,auVar40,auVar269._0_32_);
    auVar105 = vfmadd231ps_avx512vl(auVar101,auVar40,auVar261._0_32_);
    auVar106 = vfmadd231ps_avx512vl(auVar102,auVar40,auVar262._0_32_);
    auVar100 = vfmadd231ps_avx512vl(auVar103,auVar263._0_32_,auVar40);
    auVar107 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar101 = vxorps_avx512vl(auVar99,auVar107);
    auVar102 = vxorps_avx512vl(ZEXT1632(auVar86),auVar107);
    auVar229._0_4_ = auVar102._0_4_ * fVar246;
    auVar229._4_4_ = auVar102._4_4_ * fVar248;
    auVar229._8_4_ = auVar102._8_4_ * fVar220;
    auVar229._12_4_ = auVar102._12_4_ * fVar164;
    auVar229._16_4_ = auVar102._16_4_ * 0.0;
    auVar229._20_4_ = auVar102._20_4_ * 0.0;
    auVar229._24_4_ = auVar102._24_4_ * 0.0;
    auVar229._28_4_ = 0;
    auVar102 = vmulps_avx512vl(auVar184._0_32_,auVar98);
    auVar98 = vsubps_avx(auVar229,auVar102);
    auVar45._4_4_ = auVar101._4_4_ * fVar247 * 0.5;
    auVar45._0_4_ = auVar101._0_4_ * fVar243 * 0.5;
    auVar45._8_4_ = auVar101._8_4_ * fVar219 * 0.5;
    auVar45._12_4_ = auVar101._12_4_ * fVar221 * 0.5;
    auVar45._16_4_ = auVar101._16_4_ * fVar213 * 0.5;
    auVar45._20_4_ = auVar101._20_4_ * fVar231 * 0.5;
    auVar45._24_4_ = auVar101._24_4_ * fVar232 * 0.5;
    auVar45._28_4_ = auVar99._28_4_;
    auVar46._4_4_ = auVar98._4_4_ * 0.5;
    auVar46._0_4_ = auVar98._0_4_ * 0.5;
    auVar46._8_4_ = auVar98._8_4_ * 0.5;
    auVar46._12_4_ = auVar98._12_4_ * 0.5;
    auVar46._16_4_ = auVar98._16_4_ * 0.5;
    auVar46._20_4_ = auVar98._20_4_ * 0.5;
    auVar46._24_4_ = auVar98._24_4_ * 0.5;
    auVar46._28_4_ = auVar98._28_4_;
    auVar47._4_4_ = (auVar102._4_4_ + fVar247 * fVar247) * 0.5;
    auVar47._0_4_ = (auVar102._0_4_ + fVar243 * fVar243) * 0.5;
    auVar47._8_4_ = (auVar102._8_4_ + fVar219 * fVar219) * 0.5;
    auVar47._12_4_ = (auVar102._12_4_ + fVar221 * fVar221) * 0.5;
    auVar47._16_4_ = (auVar102._16_4_ + fVar213 * fVar213) * 0.5;
    auVar47._20_4_ = (auVar102._20_4_ + fVar231 * fVar231) * 0.5;
    auVar47._24_4_ = (auVar102._24_4_ + fVar232 * fVar232) * 0.5;
    auVar47._28_4_ = auVar102._28_4_ + auVar242._28_4_;
    fVar243 = fVar246 * fVar246 * 0.5;
    fVar246 = fVar248 * fVar248 * 0.5;
    fVar247 = fVar220 * fVar220 * 0.5;
    fVar248 = fVar164 * fVar164 * 0.5;
    auVar48._28_4_ = auVar245._28_4_;
    auVar48._0_28_ = ZEXT1628(CONCAT412(fVar248,CONCAT48(fVar247,CONCAT44(fVar246,fVar243))));
    auVar49._4_4_ = auVar273._4_4_ * fVar246;
    auVar49._0_4_ = auVar273._0_4_ * fVar243;
    auVar49._8_4_ = auVar273._8_4_ * fVar247;
    auVar49._12_4_ = auVar273._12_4_ * fVar248;
    auVar49._16_4_ = auVar273._16_4_ * 0.0;
    auVar49._20_4_ = auVar273._20_4_ * 0.0;
    auVar49._24_4_ = auVar273._24_4_ * 0.0;
    auVar49._28_4_ = 0x3f000000;
    auVar99 = vmulps_avx512vl(local_260,auVar48);
    auVar98 = vmulps_avx512vl(local_280,auVar48);
    auVar50._4_4_ = local_2a0._4_4_ * fVar246;
    auVar50._0_4_ = local_2a0._0_4_ * fVar243;
    auVar50._8_4_ = local_2a0._8_4_ * fVar247;
    auVar50._12_4_ = local_2a0._12_4_ * fVar248;
    auVar50._16_4_ = local_2a0._16_4_ * 0.0;
    auVar50._20_4_ = local_2a0._20_4_ * 0.0;
    auVar50._24_4_ = local_2a0._24_4_ * 0.0;
    auVar50._28_4_ = auVar245._28_4_;
    auVar101 = vfmadd231ps_avx512vl(auVar49,auVar47,auVar268._0_32_);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar47,auVar270._0_32_);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar47,auVar271._0_32_);
    auVar102 = vfmadd231ps_avx512vl(auVar50,auVar272._0_32_,auVar47);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar46,auVar264._0_32_);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar46,auVar265._0_32_);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar46,auVar266._0_32_);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar267._0_32_,auVar46);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar45,auVar269._0_32_);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar45,auVar261._0_32_);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar45,auVar262._0_32_);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar263._0_32_,auVar45);
    auVar51._4_4_ = auVar101._4_4_ * fVar233;
    auVar51._0_4_ = auVar101._0_4_ * fVar233;
    auVar51._8_4_ = auVar101._8_4_ * fVar233;
    auVar51._12_4_ = auVar101._12_4_ * fVar233;
    auVar51._16_4_ = auVar101._16_4_ * fVar233;
    auVar51._20_4_ = auVar101._20_4_ * fVar233;
    auVar51._24_4_ = auVar101._24_4_ * fVar233;
    auVar51._28_4_ = auVar257._28_4_;
    auVar257 = ZEXT3264(auVar51);
    auVar52._4_4_ = auVar99._4_4_ * fVar233;
    auVar52._0_4_ = auVar99._0_4_ * fVar233;
    auVar52._8_4_ = auVar99._8_4_ * fVar233;
    auVar52._12_4_ = auVar99._12_4_ * fVar233;
    auVar52._16_4_ = auVar99._16_4_ * fVar233;
    auVar52._20_4_ = auVar99._20_4_ * fVar233;
    auVar52._24_4_ = auVar99._24_4_ * fVar233;
    auVar52._28_4_ = 0x3e2aaaab;
    auVar53._4_4_ = auVar98._4_4_ * fVar233;
    auVar53._0_4_ = auVar98._0_4_ * fVar233;
    auVar53._8_4_ = auVar98._8_4_ * fVar233;
    auVar53._12_4_ = auVar98._12_4_ * fVar233;
    auVar53._16_4_ = auVar98._16_4_ * fVar233;
    auVar53._20_4_ = auVar98._20_4_ * fVar233;
    auVar53._24_4_ = auVar98._24_4_ * fVar233;
    auVar53._28_4_ = 0x40c00000;
    fVar243 = auVar102._0_4_ * fVar233;
    fVar246 = auVar102._4_4_ * fVar233;
    auVar54._4_4_ = fVar246;
    auVar54._0_4_ = fVar243;
    fVar247 = auVar102._8_4_ * fVar233;
    auVar54._8_4_ = fVar247;
    fVar248 = auVar102._12_4_ * fVar233;
    auVar54._12_4_ = fVar248;
    fVar219 = auVar102._16_4_ * fVar233;
    auVar54._16_4_ = fVar219;
    fVar220 = auVar102._20_4_ * fVar233;
    auVar54._20_4_ = fVar220;
    fVar221 = auVar102._24_4_ * fVar233;
    auVar54._24_4_ = fVar221;
    auVar54._28_4_ = fVar233;
    auVar86 = vxorps_avx512vl(auVar272._0_16_,auVar272._0_16_);
    auVar97 = vpermt2ps_avx512vl(auVar104,_DAT_01feed00,ZEXT1632(auVar86));
    auVar249 = ZEXT3264(auVar97);
    auVar108 = vpermt2ps_avx512vl(auVar105,_DAT_01feed00,ZEXT1632(auVar86));
    auVar101 = ZEXT1632(auVar86);
    auVar109 = vpermt2ps_avx512vl(auVar106,_DAT_01feed00,auVar101);
    auVar252 = ZEXT3264(auVar109);
    auVar230._0_4_ = fVar243 + auVar100._0_4_;
    auVar230._4_4_ = fVar246 + auVar100._4_4_;
    auVar230._8_4_ = fVar247 + auVar100._8_4_;
    auVar230._12_4_ = fVar248 + auVar100._12_4_;
    auVar230._16_4_ = fVar219 + auVar100._16_4_;
    auVar230._20_4_ = fVar220 + auVar100._20_4_;
    auVar230._24_4_ = fVar221 + auVar100._24_4_;
    auVar230._28_4_ = fVar233 + auVar100._28_4_;
    auVar99 = vmaxps_avx(auVar100,auVar230);
    auVar98 = vminps_avx(auVar100,auVar230);
    auVar95 = vpermt2ps_avx512vl(auVar100,_DAT_01feed00,auVar101);
    auVar96 = vpermt2ps_avx512vl(auVar51,_DAT_01feed00,auVar101);
    auVar245 = ZEXT3264(auVar96);
    auVar110 = vpermt2ps_avx512vl(auVar52,_DAT_01feed00,auVar101);
    auVar123 = ZEXT1632(auVar86);
    auVar111 = vpermt2ps_avx512vl(auVar53,_DAT_01feed00,auVar123);
    auVar100 = vpermt2ps_avx512vl(auVar54,_DAT_01feed00,auVar123);
    auVar112 = vsubps_avx512vl(auVar95,auVar100);
    auVar100 = vsubps_avx(auVar97,auVar104);
    auVar242 = ZEXT3264(auVar100);
    auVar101 = vsubps_avx(auVar108,auVar105);
    auVar102 = vsubps_avx(auVar109,auVar106);
    auVar103 = vmulps_avx512vl(auVar101,auVar53);
    auVar103 = vfmsub231ps_avx512vl(auVar103,auVar52,auVar102);
    auVar113 = vmulps_avx512vl(auVar102,auVar51);
    auVar113 = vfmsub231ps_avx512vl(auVar113,auVar53,auVar100);
    auVar114 = vmulps_avx512vl(auVar100,auVar52);
    auVar114 = vfmsub231ps_avx512vl(auVar114,auVar51,auVar101);
    auVar114 = vmulps_avx512vl(auVar114,auVar114);
    auVar113 = vfmadd231ps_avx512vl(auVar114,auVar113,auVar113);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar103,auVar103);
    auVar103 = vmulps_avx512vl(auVar102,auVar102);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar101,auVar101);
    auVar114 = vfmadd231ps_avx512vl(auVar103,auVar100,auVar100);
    auVar115 = vrcp14ps_avx512vl(auVar114);
    auVar103 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar116 = vfnmadd213ps_avx512vl(auVar115,auVar114,auVar103);
    auVar115 = vfmadd132ps_avx512vl(auVar116,auVar115,auVar115);
    auVar113 = vmulps_avx512vl(auVar113,auVar115);
    auVar116 = vmulps_avx512vl(auVar101,auVar111);
    auVar116 = vfmsub231ps_avx512vl(auVar116,auVar110,auVar102);
    auVar117 = vmulps_avx512vl(auVar102,auVar96);
    auVar117 = vfmsub231ps_avx512vl(auVar117,auVar111,auVar100);
    auVar118 = vmulps_avx512vl(auVar100,auVar110);
    auVar118 = vfmsub231ps_avx512vl(auVar118,auVar96,auVar101);
    auVar118 = vmulps_avx512vl(auVar118,auVar118);
    auVar117 = vfmadd231ps_avx512vl(auVar118,auVar117,auVar117);
    auVar116 = vfmadd231ps_avx512vl(auVar117,auVar116,auVar116);
    auVar115 = vmulps_avx512vl(auVar116,auVar115);
    auVar113 = vmaxps_avx512vl(auVar113,auVar115);
    auVar113 = vsqrtps_avx512vl(auVar113);
    auVar115 = vmaxps_avx512vl(auVar112,auVar95);
    auVar99 = vmaxps_avx512vl(auVar99,auVar115);
    auVar115 = vaddps_avx512vl(auVar113,auVar99);
    auVar99 = vminps_avx512vl(auVar112,auVar95);
    auVar99 = vminps_avx(auVar98,auVar99);
    auVar99 = vsubps_avx512vl(auVar99,auVar113);
    auVar27._8_4_ = 0x3f800002;
    auVar27._0_8_ = 0x3f8000023f800002;
    auVar27._12_4_ = 0x3f800002;
    auVar27._16_4_ = 0x3f800002;
    auVar27._20_4_ = 0x3f800002;
    auVar27._24_4_ = 0x3f800002;
    auVar27._28_4_ = 0x3f800002;
    auVar98 = vmulps_avx512vl(auVar115,auVar27);
    auVar28._8_4_ = 0x3f7ffffc;
    auVar28._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar28._12_4_ = 0x3f7ffffc;
    auVar28._16_4_ = 0x3f7ffffc;
    auVar28._20_4_ = 0x3f7ffffc;
    auVar28._24_4_ = 0x3f7ffffc;
    auVar28._28_4_ = 0x3f7ffffc;
    local_6e0 = vmulps_avx512vl(auVar99,auVar28);
    auVar99 = vmulps_avx512vl(auVar98,auVar98);
    auVar98 = vrsqrt14ps_avx512vl(auVar114);
    auVar29._8_4_ = 0xbf000000;
    auVar29._0_8_ = 0xbf000000bf000000;
    auVar29._12_4_ = 0xbf000000;
    auVar29._16_4_ = 0xbf000000;
    auVar29._20_4_ = 0xbf000000;
    auVar29._24_4_ = 0xbf000000;
    auVar29._28_4_ = 0xbf000000;
    auVar95 = vmulps_avx512vl(auVar114,auVar29);
    fVar243 = auVar98._0_4_;
    fVar246 = auVar98._4_4_;
    fVar247 = auVar98._8_4_;
    fVar248 = auVar98._12_4_;
    fVar219 = auVar98._16_4_;
    fVar220 = auVar98._20_4_;
    fVar221 = auVar98._24_4_;
    auVar55._4_4_ = fVar246 * fVar246 * fVar246 * auVar95._4_4_;
    auVar55._0_4_ = fVar243 * fVar243 * fVar243 * auVar95._0_4_;
    auVar55._8_4_ = fVar247 * fVar247 * fVar247 * auVar95._8_4_;
    auVar55._12_4_ = fVar248 * fVar248 * fVar248 * auVar95._12_4_;
    auVar55._16_4_ = fVar219 * fVar219 * fVar219 * auVar95._16_4_;
    auVar55._20_4_ = fVar220 * fVar220 * fVar220 * auVar95._20_4_;
    auVar55._24_4_ = fVar221 * fVar221 * fVar221 * auVar95._24_4_;
    auVar55._28_4_ = auVar115._28_4_;
    auVar30._8_4_ = 0x3fc00000;
    auVar30._0_8_ = 0x3fc000003fc00000;
    auVar30._12_4_ = 0x3fc00000;
    auVar30._16_4_ = 0x3fc00000;
    auVar30._20_4_ = 0x3fc00000;
    auVar30._24_4_ = 0x3fc00000;
    auVar30._28_4_ = 0x3fc00000;
    auVar98 = vfmadd231ps_avx512vl(auVar55,auVar98,auVar30);
    auVar95 = vmulps_avx512vl(auVar100,auVar98);
    auVar112 = vmulps_avx512vl(auVar101,auVar98);
    auVar113 = vmulps_avx512vl(auVar102,auVar98);
    auVar114 = vsubps_avx512vl(auVar123,auVar104);
    auVar115 = vsubps_avx512vl(auVar123,auVar105);
    auVar116 = vsubps_avx512vl(auVar123,auVar106);
    auVar117 = vmulps_avx512vl(local_440,auVar116);
    auVar117 = vfmadd231ps_avx512vl(auVar117,local_420,auVar115);
    auVar117 = vfmadd231ps_avx512vl(auVar117,local_400,auVar114);
    auVar118 = vmulps_avx512vl(auVar116,auVar116);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar115,auVar115);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar114,auVar114);
    auVar119 = vmulps_avx512vl(local_440,auVar113);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar112,local_420);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar95,local_400);
    auVar113 = vmulps_avx512vl(auVar116,auVar113);
    auVar112 = vfmadd231ps_avx512vl(auVar113,auVar115,auVar112);
    auVar95 = vfmadd231ps_avx512vl(auVar112,auVar114,auVar95);
    auVar112 = vmulps_avx512vl(auVar119,auVar119);
    auVar113 = vsubps_avx512vl(local_220,auVar112);
    auVar120 = vmulps_avx512vl(auVar119,auVar95);
    auVar117 = vsubps_avx512vl(auVar117,auVar120);
    auVar117 = vaddps_avx512vl(auVar117,auVar117);
    auVar120 = vmulps_avx512vl(auVar95,auVar95);
    local_700 = vsubps_avx512vl(auVar118,auVar120);
    auVar99 = vsubps_avx512vl(local_700,auVar99);
    local_7a0 = vmulps_avx512vl(auVar117,auVar117);
    auVar31._8_4_ = 0x40800000;
    auVar31._0_8_ = 0x4080000040800000;
    auVar31._12_4_ = 0x40800000;
    auVar31._16_4_ = 0x40800000;
    auVar31._20_4_ = 0x40800000;
    auVar31._24_4_ = 0x40800000;
    auVar31._28_4_ = 0x40800000;
    _local_7c0 = vmulps_avx512vl(auVar113,auVar31);
    auVar118 = vmulps_avx512vl(_local_7c0,auVar99);
    auVar118 = vsubps_avx512vl(local_7a0,auVar118);
    uVar82 = vcmpps_avx512vl(auVar118,auVar123,5);
    bVar72 = (byte)uVar82;
    fVar243 = (float)local_9c0._0_4_;
    fVar246 = (float)local_9c0._4_4_;
    fVar247 = fStack_9b8;
    fVar248 = fStack_9b4;
    fVar219 = fStack_9b0;
    fVar220 = fStack_9ac;
    fVar221 = fStack_9a8;
    fVar164 = fStack_9a4;
    if (bVar72 == 0) {
LAB_01dfbb2d:
      auVar236 = ZEXT3264(auVar103);
      auVar269 = ZEXT3264(local_8e0);
      auVar261 = ZEXT3264(local_900);
      auVar262 = ZEXT3264(local_920);
      auVar263 = ZEXT3264(local_940);
      auVar264 = ZEXT3264(local_800);
      auVar265 = ZEXT3264(local_960);
      auVar266 = ZEXT3264(local_820);
      auVar267 = ZEXT3264(local_980);
      auVar268 = ZEXT3264(local_840);
      auVar270 = ZEXT3264(local_860);
      auVar271 = ZEXT3264(local_880);
      auVar272 = ZEXT3264(local_8c0);
      auVar273 = ZEXT3264(local_9a0);
    }
    else {
      auVar118 = vsqrtps_avx512vl(auVar118);
      auVar120 = vaddps_avx512vl(auVar113,auVar113);
      local_7e0 = vrcp14ps_avx512vl(auVar120);
      auVar103 = vfnmadd213ps_avx512vl(local_7e0,auVar120,auVar103);
      auVar103 = vfmadd132ps_avx512vl(auVar103,local_7e0,local_7e0);
      _local_560 = vxorps_avx512vl(auVar117,auVar107);
      auVar107 = vsubps_avx512vl(_local_560,auVar118);
      auVar107 = vmulps_avx512vl(auVar107,auVar103);
      auVar118 = vsubps_avx512vl(auVar118,auVar117);
      local_540 = vmulps_avx512vl(auVar118,auVar103);
      auVar103 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar118 = vblendmps_avx512vl(auVar103,auVar107);
      auVar121._0_4_ =
           (uint)(bVar72 & 1) * auVar118._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar103._0_4_;
      bVar81 = (bool)((byte)(uVar82 >> 1) & 1);
      auVar121._4_4_ = (uint)bVar81 * auVar118._4_4_ | (uint)!bVar81 * auVar103._4_4_;
      bVar81 = (bool)((byte)(uVar82 >> 2) & 1);
      auVar121._8_4_ = (uint)bVar81 * auVar118._8_4_ | (uint)!bVar81 * auVar103._8_4_;
      bVar81 = (bool)((byte)(uVar82 >> 3) & 1);
      auVar121._12_4_ = (uint)bVar81 * auVar118._12_4_ | (uint)!bVar81 * auVar103._12_4_;
      bVar81 = (bool)((byte)(uVar82 >> 4) & 1);
      auVar121._16_4_ = (uint)bVar81 * auVar118._16_4_ | (uint)!bVar81 * auVar103._16_4_;
      bVar81 = (bool)((byte)(uVar82 >> 5) & 1);
      auVar121._20_4_ = (uint)bVar81 * auVar118._20_4_ | (uint)!bVar81 * auVar103._20_4_;
      bVar81 = (bool)((byte)(uVar82 >> 6) & 1);
      auVar121._24_4_ = (uint)bVar81 * auVar118._24_4_ | (uint)!bVar81 * auVar103._24_4_;
      bVar81 = SUB81(uVar82 >> 7,0);
      auVar121._28_4_ = (uint)bVar81 * auVar118._28_4_ | (uint)!bVar81 * auVar103._28_4_;
      auVar103 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar118 = vblendmps_avx512vl(auVar103,local_540);
      auVar122._0_4_ =
           (uint)(bVar72 & 1) * auVar118._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar103._0_4_;
      bVar81 = (bool)((byte)(uVar82 >> 1) & 1);
      auVar122._4_4_ = (uint)bVar81 * auVar118._4_4_ | (uint)!bVar81 * auVar103._4_4_;
      bVar81 = (bool)((byte)(uVar82 >> 2) & 1);
      auVar122._8_4_ = (uint)bVar81 * auVar118._8_4_ | (uint)!bVar81 * auVar103._8_4_;
      bVar81 = (bool)((byte)(uVar82 >> 3) & 1);
      auVar122._12_4_ = (uint)bVar81 * auVar118._12_4_ | (uint)!bVar81 * auVar103._12_4_;
      bVar81 = (bool)((byte)(uVar82 >> 4) & 1);
      auVar122._16_4_ = (uint)bVar81 * auVar118._16_4_ | (uint)!bVar81 * auVar103._16_4_;
      bVar81 = (bool)((byte)(uVar82 >> 5) & 1);
      auVar122._20_4_ = (uint)bVar81 * auVar118._20_4_ | (uint)!bVar81 * auVar103._20_4_;
      bVar81 = (bool)((byte)(uVar82 >> 6) & 1);
      auVar122._24_4_ = (uint)bVar81 * auVar118._24_4_ | (uint)!bVar81 * auVar103._24_4_;
      bVar81 = SUB81(uVar82 >> 7,0);
      auVar122._28_4_ = (uint)bVar81 * auVar118._28_4_ | (uint)!bVar81 * auVar103._28_4_;
      auVar103 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar112,auVar103);
      local_580 = vmaxps_avx512vl(local_240,auVar103);
      auVar32._8_4_ = 0x36000000;
      auVar32._0_8_ = 0x3600000036000000;
      auVar32._12_4_ = 0x36000000;
      auVar32._16_4_ = 0x36000000;
      auVar32._20_4_ = 0x36000000;
      auVar32._24_4_ = 0x36000000;
      auVar32._28_4_ = 0x36000000;
      local_5a0 = vmulps_avx512vl(local_580,auVar32);
      vandps_avx512vl(auVar113,auVar103);
      uVar83 = vcmpps_avx512vl(local_5a0,local_5a0,1);
      uVar82 = uVar82 & uVar83;
      bVar76 = (byte)uVar82;
      if (bVar76 != 0) {
        uVar83 = vcmpps_avx512vl(auVar99,_DAT_01faff00,2);
        auVar99 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar103 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar112 = vblendmps_avx512vl(auVar99,auVar103);
        bVar78 = (byte)uVar83;
        uVar85 = (uint)(bVar78 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar78 & 1) * local_5a0._0_4_;
        bVar81 = (bool)((byte)(uVar83 >> 1) & 1);
        uVar84 = (uint)bVar81 * auVar112._4_4_ | (uint)!bVar81 * local_5a0._4_4_;
        bVar81 = (bool)((byte)(uVar83 >> 2) & 1);
        uVar136 = (uint)bVar81 * auVar112._8_4_ | (uint)!bVar81 * local_5a0._8_4_;
        bVar81 = (bool)((byte)(uVar83 >> 3) & 1);
        uVar137 = (uint)bVar81 * auVar112._12_4_ | (uint)!bVar81 * local_5a0._12_4_;
        bVar81 = (bool)((byte)(uVar83 >> 4) & 1);
        uVar138 = (uint)bVar81 * auVar112._16_4_ | (uint)!bVar81 * local_5a0._16_4_;
        bVar81 = (bool)((byte)(uVar83 >> 5) & 1);
        uVar139 = (uint)bVar81 * auVar112._20_4_ | (uint)!bVar81 * local_5a0._20_4_;
        bVar81 = (bool)((byte)(uVar83 >> 6) & 1);
        uVar140 = (uint)bVar81 * auVar112._24_4_ | (uint)!bVar81 * local_5a0._24_4_;
        bVar81 = SUB81(uVar83 >> 7,0);
        uVar141 = (uint)bVar81 * auVar112._28_4_ | (uint)!bVar81 * local_5a0._28_4_;
        auVar121._0_4_ = (bVar76 & 1) * uVar85 | !(bool)(bVar76 & 1) * auVar121._0_4_;
        bVar81 = (bool)((byte)(uVar82 >> 1) & 1);
        auVar121._4_4_ = bVar81 * uVar84 | !bVar81 * auVar121._4_4_;
        bVar81 = (bool)((byte)(uVar82 >> 2) & 1);
        auVar121._8_4_ = bVar81 * uVar136 | !bVar81 * auVar121._8_4_;
        bVar81 = (bool)((byte)(uVar82 >> 3) & 1);
        auVar121._12_4_ = bVar81 * uVar137 | !bVar81 * auVar121._12_4_;
        bVar81 = (bool)((byte)(uVar82 >> 4) & 1);
        auVar121._16_4_ = bVar81 * uVar138 | !bVar81 * auVar121._16_4_;
        bVar81 = (bool)((byte)(uVar82 >> 5) & 1);
        auVar121._20_4_ = bVar81 * uVar139 | !bVar81 * auVar121._20_4_;
        bVar81 = (bool)((byte)(uVar82 >> 6) & 1);
        auVar121._24_4_ = bVar81 * uVar140 | !bVar81 * auVar121._24_4_;
        bVar81 = SUB81(uVar82 >> 7,0);
        auVar121._28_4_ = bVar81 * uVar141 | !bVar81 * auVar121._28_4_;
        auVar99 = vblendmps_avx512vl(auVar103,auVar99);
        bVar81 = (bool)((byte)(uVar83 >> 1) & 1);
        bVar10 = (bool)((byte)(uVar83 >> 2) & 1);
        bVar11 = (bool)((byte)(uVar83 >> 3) & 1);
        bVar12 = (bool)((byte)(uVar83 >> 4) & 1);
        bVar13 = (bool)((byte)(uVar83 >> 5) & 1);
        bVar14 = (bool)((byte)(uVar83 >> 6) & 1);
        bVar15 = SUB81(uVar83 >> 7,0);
        auVar122._0_4_ =
             (uint)(bVar76 & 1) *
             ((uint)(bVar78 & 1) * auVar99._0_4_ | !(bool)(bVar78 & 1) * uVar85) |
             !(bool)(bVar76 & 1) * auVar122._0_4_;
        bVar9 = (bool)((byte)(uVar82 >> 1) & 1);
        auVar122._4_4_ =
             (uint)bVar9 * ((uint)bVar81 * auVar99._4_4_ | !bVar81 * uVar84) |
             !bVar9 * auVar122._4_4_;
        bVar81 = (bool)((byte)(uVar82 >> 2) & 1);
        auVar122._8_4_ =
             (uint)bVar81 * ((uint)bVar10 * auVar99._8_4_ | !bVar10 * uVar136) |
             !bVar81 * auVar122._8_4_;
        bVar81 = (bool)((byte)(uVar82 >> 3) & 1);
        auVar122._12_4_ =
             (uint)bVar81 * ((uint)bVar11 * auVar99._12_4_ | !bVar11 * uVar137) |
             !bVar81 * auVar122._12_4_;
        bVar81 = (bool)((byte)(uVar82 >> 4) & 1);
        auVar122._16_4_ =
             (uint)bVar81 * ((uint)bVar12 * auVar99._16_4_ | !bVar12 * uVar138) |
             !bVar81 * auVar122._16_4_;
        bVar81 = (bool)((byte)(uVar82 >> 5) & 1);
        auVar122._20_4_ =
             (uint)bVar81 * ((uint)bVar13 * auVar99._20_4_ | !bVar13 * uVar139) |
             !bVar81 * auVar122._20_4_;
        bVar81 = (bool)((byte)(uVar82 >> 6) & 1);
        auVar122._24_4_ =
             (uint)bVar81 * ((uint)bVar14 * auVar99._24_4_ | !bVar14 * uVar140) |
             !bVar81 * auVar122._24_4_;
        bVar81 = SUB81(uVar82 >> 7,0);
        auVar122._28_4_ =
             (uint)bVar81 * ((uint)bVar15 * auVar99._28_4_ | !bVar15 * uVar141) |
             !bVar81 * auVar122._28_4_;
        bVar72 = (~bVar76 | bVar78) & bVar72;
      }
      auVar272 = ZEXT3264(local_8c0);
      if ((bVar72 & 0x7f) == 0) {
        auVar236 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar269 = ZEXT3264(local_8e0);
        auVar261 = ZEXT3264(local_900);
        auVar262 = ZEXT3264(local_920);
        auVar263 = ZEXT3264(local_940);
        auVar264 = ZEXT3264(local_800);
        auVar265 = ZEXT3264(local_960);
        auVar266 = ZEXT3264(local_820);
        auVar267 = ZEXT3264(local_980);
        auVar268 = ZEXT3264(local_840);
        auVar270 = ZEXT3264(local_860);
        auVar271 = ZEXT3264(local_880);
        auVar273 = ZEXT3264(local_9a0);
      }
      else {
        auVar99 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar111 = vxorps_avx512vl(auVar111,auVar99);
        auVar96 = vxorps_avx512vl(auVar96,auVar99);
        uVar85 = *(uint *)(ray + k * 4 + 0x80);
        auVar110 = vxorps_avx512vl(auVar110,auVar99);
        local_770 = ZEXT416(uVar85);
        auVar86 = vsubss_avx512f(local_770,ZEXT416((uint)local_610._0_4_));
        auVar103 = vbroadcastss_avx512vl(auVar86);
        auVar112 = vminps_avx512vl(auVar103,auVar122);
        auVar70._4_4_ = fStack_2bc;
        auVar70._0_4_ = local_2c0;
        auVar70._8_4_ = fStack_2b8;
        auVar70._12_4_ = fStack_2b4;
        auVar70._16_4_ = fStack_2b0;
        auVar70._20_4_ = fStack_2ac;
        auVar70._24_4_ = fStack_2a8;
        auVar70._28_4_ = fStack_2a4;
        auVar113 = vmaxps_avx512vl(auVar70,auVar121);
        auVar103 = vmulps_avx512vl(auVar53,auVar116);
        auVar103 = vfmadd213ps_avx512vl(auVar115,auVar52,auVar103);
        auVar86 = vfmadd213ps_fma(auVar114,auVar51,auVar103);
        auVar103 = vmulps_avx512vl(local_440,auVar53);
        auVar103 = vfmadd231ps_avx512vl(auVar103,local_420,auVar52);
        auVar88 = vfmadd231ps_fma(auVar103,local_400,auVar51);
        auVar114 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(ZEXT1632(auVar88),auVar114);
        auVar115 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
        uVar16 = vcmpps_avx512vl(auVar114,auVar115,1);
        auVar116 = vxorps_avx512vl(ZEXT1632(auVar86),auVar99);
        auVar118 = vrcp14ps_avx512vl(ZEXT1632(auVar88));
        auVar179 = ZEXT1632(auVar88);
        auVar123 = vxorps_avx512vl(auVar179,auVar99);
        auVar103 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar124 = vfnmadd213ps_avx512vl(auVar118,auVar179,auVar103);
        auVar86 = vfmadd132ps_fma(auVar124,auVar118,auVar118);
        fVar213 = auVar86._0_4_ * auVar116._0_4_;
        fVar231 = auVar86._4_4_ * auVar116._4_4_;
        auVar56._4_4_ = fVar231;
        auVar56._0_4_ = fVar213;
        fVar232 = auVar86._8_4_ * auVar116._8_4_;
        auVar56._8_4_ = fVar232;
        fVar233 = auVar86._12_4_ * auVar116._12_4_;
        auVar56._12_4_ = fVar233;
        fVar144 = auVar116._16_4_ * 0.0;
        auVar56._16_4_ = fVar144;
        fVar159 = auVar116._20_4_ * 0.0;
        auVar56._20_4_ = fVar159;
        fVar160 = auVar116._24_4_ * 0.0;
        auVar56._24_4_ = fVar160;
        auVar56._28_4_ = auVar116._28_4_;
        uVar18 = vcmpps_avx512vl(auVar179,auVar123,1);
        bVar76 = (byte)uVar16 | (byte)uVar18;
        auVar256._8_4_ = 0xff800000;
        auVar256._0_8_ = 0xff800000ff800000;
        auVar256._12_4_ = 0xff800000;
        auVar256._16_4_ = 0xff800000;
        auVar256._20_4_ = 0xff800000;
        auVar256._24_4_ = 0xff800000;
        auVar256._28_4_ = 0xff800000;
        auVar118 = vblendmps_avx512vl(auVar56,auVar256);
        auVar125._0_4_ = (uint)(bVar76 & 1) * auVar118._0_4_ | (uint)!(bool)(bVar76 & 1) * -0x800000
        ;
        bVar81 = (bool)(bVar76 >> 1 & 1);
        auVar125._4_4_ = (uint)bVar81 * auVar118._4_4_ | (uint)!bVar81 * -0x800000;
        bVar81 = (bool)(bVar76 >> 2 & 1);
        auVar125._8_4_ = (uint)bVar81 * auVar118._8_4_ | (uint)!bVar81 * -0x800000;
        bVar81 = (bool)(bVar76 >> 3 & 1);
        auVar125._12_4_ = (uint)bVar81 * auVar118._12_4_ | (uint)!bVar81 * -0x800000;
        bVar81 = (bool)(bVar76 >> 4 & 1);
        auVar125._16_4_ = (uint)bVar81 * auVar118._16_4_ | (uint)!bVar81 * -0x800000;
        bVar81 = (bool)(bVar76 >> 5 & 1);
        auVar125._20_4_ = (uint)bVar81 * auVar118._20_4_ | (uint)!bVar81 * -0x800000;
        bVar81 = (bool)(bVar76 >> 6 & 1);
        auVar125._24_4_ = (uint)bVar81 * auVar118._24_4_ | (uint)!bVar81 * -0x800000;
        auVar125._28_4_ =
             (uint)(bVar76 >> 7) * auVar118._28_4_ | (uint)!(bool)(bVar76 >> 7) * -0x800000;
        auVar118 = vmaxps_avx512vl(auVar113,auVar125);
        auVar257 = ZEXT3264(auVar118);
        uVar18 = vcmpps_avx512vl(auVar179,auVar123,6);
        bVar76 = (byte)uVar16 | (byte)uVar18;
        auVar126._0_4_ = (uint)(bVar76 & 1) * 0x7f800000 | (uint)!(bool)(bVar76 & 1) * (int)fVar213;
        bVar81 = (bool)(bVar76 >> 1 & 1);
        auVar126._4_4_ = (uint)bVar81 * 0x7f800000 | (uint)!bVar81 * (int)fVar231;
        bVar81 = (bool)(bVar76 >> 2 & 1);
        auVar126._8_4_ = (uint)bVar81 * 0x7f800000 | (uint)!bVar81 * (int)fVar232;
        bVar81 = (bool)(bVar76 >> 3 & 1);
        auVar126._12_4_ = (uint)bVar81 * 0x7f800000 | (uint)!bVar81 * (int)fVar233;
        bVar81 = (bool)(bVar76 >> 4 & 1);
        auVar126._16_4_ = (uint)bVar81 * 0x7f800000 | (uint)!bVar81 * (int)fVar144;
        bVar81 = (bool)(bVar76 >> 5 & 1);
        auVar126._20_4_ = (uint)bVar81 * 0x7f800000 | (uint)!bVar81 * (int)fVar159;
        bVar81 = (bool)(bVar76 >> 6 & 1);
        auVar126._24_4_ = (uint)bVar81 * 0x7f800000 | (uint)!bVar81 * (int)fVar160;
        auVar126._28_4_ =
             (uint)(bVar76 >> 7) * 0x7f800000 | (uint)!(bool)(bVar76 >> 7) * auVar116._28_4_;
        auVar112 = vminps_avx512vl(auVar112,auVar126);
        auVar86 = vxorps_avx512vl(auVar113._0_16_,auVar113._0_16_);
        auVar97 = vsubps_avx512vl(ZEXT1632(auVar86),auVar97);
        auVar108 = vsubps_avx512vl(ZEXT1632(auVar86),auVar108);
        auVar113 = ZEXT1632(auVar86);
        auVar109 = vsubps_avx512vl(auVar113,auVar109);
        auVar109 = vmulps_avx512vl(auVar109,auVar111);
        auVar108 = vfmadd231ps_avx512vl(auVar109,auVar110,auVar108);
        auVar97 = vfmadd231ps_avx512vl(auVar108,auVar96,auVar97);
        auVar108 = vmulps_avx512vl(local_440,auVar111);
        auVar108 = vfmadd231ps_avx512vl(auVar108,local_420,auVar110);
        auVar108 = vfmadd231ps_avx512vl(auVar108,local_400,auVar96);
        vandps_avx512vl(auVar108,auVar114);
        uVar16 = vcmpps_avx512vl(auVar108,auVar115,1);
        auVar97 = vxorps_avx512vl(auVar97,auVar99);
        auVar109 = vrcp14ps_avx512vl(auVar108);
        auVar99 = vxorps_avx512vl(auVar108,auVar99);
        auVar252 = ZEXT3264(auVar99);
        auVar96 = vfnmadd213ps_avx512vl(auVar109,auVar108,auVar103);
        auVar86 = vfmadd132ps_fma(auVar96,auVar109,auVar109);
        fVar213 = auVar86._0_4_ * auVar97._0_4_;
        fVar231 = auVar86._4_4_ * auVar97._4_4_;
        auVar57._4_4_ = fVar231;
        auVar57._0_4_ = fVar213;
        fVar232 = auVar86._8_4_ * auVar97._8_4_;
        auVar57._8_4_ = fVar232;
        fVar233 = auVar86._12_4_ * auVar97._12_4_;
        auVar57._12_4_ = fVar233;
        fVar144 = auVar97._16_4_ * 0.0;
        auVar57._16_4_ = fVar144;
        fVar159 = auVar97._20_4_ * 0.0;
        auVar57._20_4_ = fVar159;
        fVar160 = auVar97._24_4_ * 0.0;
        auVar57._24_4_ = fVar160;
        auVar57._28_4_ = auVar97._28_4_;
        uVar18 = vcmpps_avx512vl(auVar108,auVar99,1);
        bVar76 = (byte)uVar16 | (byte)uVar18;
        auVar33._8_4_ = 0xff800000;
        auVar33._0_8_ = 0xff800000ff800000;
        auVar33._12_4_ = 0xff800000;
        auVar33._16_4_ = 0xff800000;
        auVar33._20_4_ = 0xff800000;
        auVar33._24_4_ = 0xff800000;
        auVar33._28_4_ = 0xff800000;
        auVar96 = vblendmps_avx512vl(auVar57,auVar33);
        auVar127._0_4_ =
             (uint)(bVar76 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar109._0_4_;
        bVar81 = (bool)(bVar76 >> 1 & 1);
        auVar127._4_4_ = (uint)bVar81 * auVar96._4_4_ | (uint)!bVar81 * auVar109._4_4_;
        bVar81 = (bool)(bVar76 >> 2 & 1);
        auVar127._8_4_ = (uint)bVar81 * auVar96._8_4_ | (uint)!bVar81 * auVar109._8_4_;
        bVar81 = (bool)(bVar76 >> 3 & 1);
        auVar127._12_4_ = (uint)bVar81 * auVar96._12_4_ | (uint)!bVar81 * auVar109._12_4_;
        bVar81 = (bool)(bVar76 >> 4 & 1);
        auVar127._16_4_ = (uint)bVar81 * auVar96._16_4_ | (uint)!bVar81 * auVar109._16_4_;
        bVar81 = (bool)(bVar76 >> 5 & 1);
        auVar127._20_4_ = (uint)bVar81 * auVar96._20_4_ | (uint)!bVar81 * auVar109._20_4_;
        bVar81 = (bool)(bVar76 >> 6 & 1);
        auVar127._24_4_ = (uint)bVar81 * auVar96._24_4_ | (uint)!bVar81 * auVar109._24_4_;
        auVar127._28_4_ =
             (uint)(bVar76 >> 7) * auVar96._28_4_ | (uint)!(bool)(bVar76 >> 7) * auVar109._28_4_;
        _local_720 = vmaxps_avx(auVar118,auVar127);
        auVar245 = ZEXT3264(_local_720);
        uVar18 = vcmpps_avx512vl(auVar108,auVar99,6);
        bVar76 = (byte)uVar16 | (byte)uVar18;
        auVar128._0_4_ = (uint)(bVar76 & 1) * 0x7f800000 | (uint)!(bool)(bVar76 & 1) * (int)fVar213;
        bVar81 = (bool)(bVar76 >> 1 & 1);
        auVar128._4_4_ = (uint)bVar81 * 0x7f800000 | (uint)!bVar81 * (int)fVar231;
        bVar81 = (bool)(bVar76 >> 2 & 1);
        auVar128._8_4_ = (uint)bVar81 * 0x7f800000 | (uint)!bVar81 * (int)fVar232;
        bVar81 = (bool)(bVar76 >> 3 & 1);
        auVar128._12_4_ = (uint)bVar81 * 0x7f800000 | (uint)!bVar81 * (int)fVar233;
        bVar81 = (bool)(bVar76 >> 4 & 1);
        auVar128._16_4_ = (uint)bVar81 * 0x7f800000 | (uint)!bVar81 * (int)fVar144;
        bVar81 = (bool)(bVar76 >> 5 & 1);
        auVar128._20_4_ = (uint)bVar81 * 0x7f800000 | (uint)!bVar81 * (int)fVar159;
        bVar81 = (bool)(bVar76 >> 6 & 1);
        auVar128._24_4_ = (uint)bVar81 * 0x7f800000 | (uint)!bVar81 * (int)fVar160;
        auVar128._28_4_ =
             (uint)(bVar76 >> 7) * 0x7f800000 | (uint)!(bool)(bVar76 >> 7) * auVar97._28_4_;
        local_340 = vminps_avx(auVar112,auVar128);
        auVar249 = ZEXT3264(local_340);
        uVar16 = vcmpps_avx512vl(_local_720,local_340,2);
        bVar72 = bVar72 & 0x7f & (byte)uVar16;
        if (bVar72 == 0) goto LAB_01dfbb2d;
        auVar108 = vmaxps_avx512vl(auVar113,local_6e0);
        auVar99 = vfmadd213ps_avx512vl(auVar107,auVar119,auVar95);
        auVar99 = vmulps_avx512vl(auVar98,auVar99);
        auVar107 = vfmadd213ps_avx512vl(local_540,auVar119,auVar95);
        auVar58._4_4_ = auVar98._4_4_ * auVar107._4_4_;
        auVar58._0_4_ = auVar98._0_4_ * auVar107._0_4_;
        auVar58._8_4_ = auVar98._8_4_ * auVar107._8_4_;
        auVar58._12_4_ = auVar98._12_4_ * auVar107._12_4_;
        auVar58._16_4_ = auVar98._16_4_ * auVar107._16_4_;
        auVar58._20_4_ = auVar98._20_4_ * auVar107._20_4_;
        auVar58._24_4_ = auVar98._24_4_ * auVar107._24_4_;
        auVar58._28_4_ = auVar127._28_4_;
        auVar99 = vminps_avx512vl(auVar99,auVar103);
        auVar65 = ZEXT812(0);
        auVar97 = ZEXT1232(auVar65) << 0x20;
        auVar99 = vmaxps_avx(auVar99,ZEXT1232(auVar65) << 0x20);
        auVar109 = vminps_avx512vl(auVar58,auVar103);
        auVar59._4_4_ = (auVar99._4_4_ + 1.0) * 0.125;
        auVar59._0_4_ = (auVar99._0_4_ + 0.0) * 0.125;
        auVar59._8_4_ = (auVar99._8_4_ + 2.0) * 0.125;
        auVar59._12_4_ = (auVar99._12_4_ + 3.0) * 0.125;
        auVar59._16_4_ = (auVar99._16_4_ + 4.0) * 0.125;
        auVar59._20_4_ = (auVar99._20_4_ + 5.0) * 0.125;
        auVar59._24_4_ = (auVar99._24_4_ + 6.0) * 0.125;
        auVar59._28_4_ = auVar99._28_4_ + 7.0;
        auVar86 = vfmadd213ps_fma(auVar59,local_8a0,auVar228);
        local_1e0 = ZEXT1632(auVar86);
        auVar99 = vmaxps_avx(auVar109,ZEXT1232(auVar65) << 0x20);
        auVar60._4_4_ = (auVar99._4_4_ + 1.0) * 0.125;
        auVar60._0_4_ = (auVar99._0_4_ + 0.0) * 0.125;
        auVar60._8_4_ = (auVar99._8_4_ + 2.0) * 0.125;
        auVar60._12_4_ = (auVar99._12_4_ + 3.0) * 0.125;
        auVar60._16_4_ = (auVar99._16_4_ + 4.0) * 0.125;
        auVar60._20_4_ = (auVar99._20_4_ + 5.0) * 0.125;
        auVar60._24_4_ = (auVar99._24_4_ + 6.0) * 0.125;
        auVar60._28_4_ = auVar99._28_4_ + 7.0;
        auVar86 = vfmadd213ps_fma(auVar60,local_8a0,auVar228);
        local_200 = ZEXT1632(auVar86);
        auVar61._4_4_ = auVar108._4_4_ * auVar108._4_4_;
        auVar61._0_4_ = auVar108._0_4_ * auVar108._0_4_;
        auVar61._8_4_ = auVar108._8_4_ * auVar108._8_4_;
        auVar61._12_4_ = auVar108._12_4_ * auVar108._12_4_;
        auVar61._16_4_ = auVar108._16_4_ * auVar108._16_4_;
        auVar61._20_4_ = auVar108._20_4_ * auVar108._20_4_;
        auVar61._24_4_ = auVar108._24_4_ * auVar108._24_4_;
        auVar61._28_4_ = auVar108._28_4_;
        auVar99 = vsubps_avx(local_700,auVar61);
        auVar62._4_4_ = auVar99._4_4_ * (float)local_7c0._4_4_;
        auVar62._0_4_ = auVar99._0_4_ * (float)local_7c0._0_4_;
        auVar62._8_4_ = auVar99._8_4_ * fStack_7b8;
        auVar62._12_4_ = auVar99._12_4_ * fStack_7b4;
        auVar62._16_4_ = auVar99._16_4_ * fStack_7b0;
        auVar62._20_4_ = auVar99._20_4_ * fStack_7ac;
        auVar62._24_4_ = auVar99._24_4_ * fStack_7a8;
        auVar62._28_4_ = auVar108._28_4_;
        auVar107 = vsubps_avx(local_7a0,auVar62);
        uVar82 = vcmpps_avx512vl(auVar107,ZEXT1232(auVar65) << 0x20,5);
        auVar268 = ZEXT3264(local_840);
        auVar270 = ZEXT3264(local_860);
        auVar271 = ZEXT3264(local_880);
        auVar272 = ZEXT3264(local_8c0);
        if ((byte)uVar82 == 0) {
          uVar82 = 0;
          auVar98 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar184 = ZEXT864(0) << 0x20;
          auVar103 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar107 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar250 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar129._8_4_ = 0x7f800000;
          auVar129._0_8_ = 0x7f8000007f800000;
          auVar129._12_4_ = 0x7f800000;
          auVar129._16_4_ = 0x7f800000;
          auVar129._20_4_ = 0x7f800000;
          auVar129._24_4_ = 0x7f800000;
          auVar129._28_4_ = 0x7f800000;
          auVar130._8_4_ = 0xff800000;
          auVar130._0_8_ = 0xff800000ff800000;
          auVar130._12_4_ = 0xff800000;
          auVar130._16_4_ = 0xff800000;
          auVar130._20_4_ = 0xff800000;
          auVar130._24_4_ = 0xff800000;
          auVar130._28_4_ = 0xff800000;
        }
        else {
          uVar83 = vcmpps_avx512vl(auVar107,auVar113,5);
          auVar107 = vsqrtps_avx(auVar107);
          auVar103 = vfnmadd213ps_avx512vl(auVar120,local_7e0,auVar103);
          auVar97 = vfmadd132ps_avx512vl(auVar103,local_7e0,local_7e0);
          auVar103 = vsubps_avx(_local_560,auVar107);
          auVar108 = vmulps_avx512vl(auVar103,auVar97);
          auVar103 = vsubps_avx512vl(auVar107,auVar117);
          auVar96 = vmulps_avx512vl(auVar103,auVar97);
          auVar103 = vfmadd213ps_avx512vl(auVar119,auVar108,auVar95);
          auVar63._4_4_ = auVar98._4_4_ * auVar103._4_4_;
          auVar63._0_4_ = auVar98._0_4_ * auVar103._0_4_;
          auVar63._8_4_ = auVar98._8_4_ * auVar103._8_4_;
          auVar63._12_4_ = auVar98._12_4_ * auVar103._12_4_;
          auVar63._16_4_ = auVar98._16_4_ * auVar103._16_4_;
          auVar63._20_4_ = auVar98._20_4_ * auVar103._20_4_;
          auVar63._24_4_ = auVar98._24_4_ * auVar103._24_4_;
          auVar63._28_4_ = auVar109._28_4_;
          auVar103 = vmulps_avx512vl(local_400,auVar108);
          auVar107 = vmulps_avx512vl(local_420,auVar108);
          auVar97 = vmulps_avx512vl(local_440,auVar108);
          auVar109 = vfmadd213ps_avx512vl(auVar100,auVar63,auVar104);
          auVar103 = vsubps_avx512vl(auVar103,auVar109);
          auVar109 = vfmadd213ps_avx512vl(auVar101,auVar63,auVar105);
          auVar107 = vsubps_avx512vl(auVar107,auVar109);
          auVar86 = vfmadd213ps_fma(auVar63,auVar102,auVar106);
          auVar97 = vsubps_avx(auVar97,ZEXT1632(auVar86));
          auVar250 = auVar97._0_28_;
          auVar97 = vfmadd213ps_avx512vl(auVar119,auVar96,auVar95);
          auVar109 = vmulps_avx512vl(auVar98,auVar97);
          auVar98 = vmulps_avx512vl(local_400,auVar96);
          auVar95 = vmulps_avx512vl(local_420,auVar96);
          auVar110 = vmulps_avx512vl(local_440,auVar96);
          auVar86 = vfmadd213ps_fma(auVar100,auVar109,auVar104);
          auVar97 = vsubps_avx(auVar98,ZEXT1632(auVar86));
          auVar86 = vfmadd213ps_fma(auVar101,auVar109,auVar105);
          auVar98 = vsubps_avx512vl(auVar95,ZEXT1632(auVar86));
          auVar86 = vfmadd213ps_fma(auVar102,auVar109,auVar106);
          auVar100 = vsubps_avx512vl(auVar110,ZEXT1632(auVar86));
          auVar184 = ZEXT3264(auVar100);
          auVar153._8_4_ = 0x7f800000;
          auVar153._0_8_ = 0x7f8000007f800000;
          auVar153._12_4_ = 0x7f800000;
          auVar153._16_4_ = 0x7f800000;
          auVar153._20_4_ = 0x7f800000;
          auVar153._24_4_ = 0x7f800000;
          auVar153._28_4_ = 0x7f800000;
          auVar100 = vblendmps_avx512vl(auVar153,auVar108);
          bVar81 = (bool)((byte)uVar83 & 1);
          auVar129._0_4_ = (uint)bVar81 * auVar100._0_4_ | (uint)!bVar81 * 0x7f800000;
          bVar81 = (bool)((byte)(uVar83 >> 1) & 1);
          auVar129._4_4_ = (uint)bVar81 * auVar100._4_4_ | (uint)!bVar81 * 0x7f800000;
          bVar81 = (bool)((byte)(uVar83 >> 2) & 1);
          auVar129._8_4_ = (uint)bVar81 * auVar100._8_4_ | (uint)!bVar81 * 0x7f800000;
          bVar81 = (bool)((byte)(uVar83 >> 3) & 1);
          auVar129._12_4_ = (uint)bVar81 * auVar100._12_4_ | (uint)!bVar81 * 0x7f800000;
          bVar81 = (bool)((byte)(uVar83 >> 4) & 1);
          auVar129._16_4_ = (uint)bVar81 * auVar100._16_4_ | (uint)!bVar81 * 0x7f800000;
          bVar81 = (bool)((byte)(uVar83 >> 5) & 1);
          auVar129._20_4_ = (uint)bVar81 * auVar100._20_4_ | (uint)!bVar81 * 0x7f800000;
          bVar81 = (bool)((byte)(uVar83 >> 6) & 1);
          auVar129._24_4_ = (uint)bVar81 * auVar100._24_4_ | (uint)!bVar81 * 0x7f800000;
          bVar81 = SUB81(uVar83 >> 7,0);
          auVar129._28_4_ = (uint)bVar81 * auVar100._28_4_ | (uint)!bVar81 * 0x7f800000;
          auVar206._8_4_ = 0xff800000;
          auVar206._0_8_ = 0xff800000ff800000;
          auVar206._12_4_ = 0xff800000;
          auVar206._16_4_ = 0xff800000;
          auVar206._20_4_ = 0xff800000;
          auVar206._24_4_ = 0xff800000;
          auVar206._28_4_ = 0xff800000;
          auVar100 = vblendmps_avx512vl(auVar206,auVar96);
          bVar81 = (bool)((byte)uVar83 & 1);
          auVar130._0_4_ = (uint)bVar81 * auVar100._0_4_ | (uint)!bVar81 * -0x800000;
          bVar81 = (bool)((byte)(uVar83 >> 1) & 1);
          auVar130._4_4_ = (uint)bVar81 * auVar100._4_4_ | (uint)!bVar81 * -0x800000;
          bVar81 = (bool)((byte)(uVar83 >> 2) & 1);
          auVar130._8_4_ = (uint)bVar81 * auVar100._8_4_ | (uint)!bVar81 * -0x800000;
          bVar81 = (bool)((byte)(uVar83 >> 3) & 1);
          auVar130._12_4_ = (uint)bVar81 * auVar100._12_4_ | (uint)!bVar81 * -0x800000;
          bVar81 = (bool)((byte)(uVar83 >> 4) & 1);
          auVar130._16_4_ = (uint)bVar81 * auVar100._16_4_ | (uint)!bVar81 * -0x800000;
          bVar81 = (bool)((byte)(uVar83 >> 5) & 1);
          auVar130._20_4_ = (uint)bVar81 * auVar100._20_4_ | (uint)!bVar81 * -0x800000;
          bVar81 = (bool)((byte)(uVar83 >> 6) & 1);
          auVar130._24_4_ = (uint)bVar81 * auVar100._24_4_ | (uint)!bVar81 * -0x800000;
          bVar81 = SUB81(uVar83 >> 7,0);
          auVar130._28_4_ = (uint)bVar81 * auVar100._28_4_ | (uint)!bVar81 * -0x800000;
          auVar34._8_4_ = 0x36000000;
          auVar34._0_8_ = 0x3600000036000000;
          auVar34._12_4_ = 0x36000000;
          auVar34._16_4_ = 0x36000000;
          auVar34._20_4_ = 0x36000000;
          auVar34._24_4_ = 0x36000000;
          auVar34._28_4_ = 0x36000000;
          auVar100 = vmulps_avx512vl(local_580,auVar34);
          uVar17 = vcmpps_avx512vl(auVar100,local_5a0,0xe);
          uVar83 = uVar83 & uVar17;
          bVar76 = (byte)uVar83;
          if (bVar76 != 0) {
            uVar17 = vcmpps_avx512vl(auVar99,ZEXT1632(ZEXT816(0) << 0x40),2);
            auVar241._8_4_ = 0x7f800000;
            auVar241._0_8_ = 0x7f8000007f800000;
            auVar241._12_4_ = 0x7f800000;
            auVar241._16_4_ = 0x7f800000;
            auVar241._20_4_ = 0x7f800000;
            auVar241._24_4_ = 0x7f800000;
            auVar241._28_4_ = 0x7f800000;
            auVar244._8_4_ = 0xff800000;
            auVar244._0_8_ = 0xff800000ff800000;
            auVar244._12_4_ = 0xff800000;
            auVar244._16_4_ = 0xff800000;
            auVar244._20_4_ = 0xff800000;
            auVar244._24_4_ = 0xff800000;
            auVar244._28_4_ = 0xff800000;
            auVar99 = vblendmps_avx512vl(auVar241,auVar244);
            bVar78 = (byte)uVar17;
            uVar84 = (uint)(bVar78 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar78 & 1) * auVar100._0_4_
            ;
            bVar81 = (bool)((byte)(uVar17 >> 1) & 1);
            uVar136 = (uint)bVar81 * auVar99._4_4_ | (uint)!bVar81 * auVar100._4_4_;
            bVar81 = (bool)((byte)(uVar17 >> 2) & 1);
            uVar137 = (uint)bVar81 * auVar99._8_4_ | (uint)!bVar81 * auVar100._8_4_;
            bVar81 = (bool)((byte)(uVar17 >> 3) & 1);
            uVar138 = (uint)bVar81 * auVar99._12_4_ | (uint)!bVar81 * auVar100._12_4_;
            bVar81 = (bool)((byte)(uVar17 >> 4) & 1);
            uVar139 = (uint)bVar81 * auVar99._16_4_ | (uint)!bVar81 * auVar100._16_4_;
            bVar81 = (bool)((byte)(uVar17 >> 5) & 1);
            uVar140 = (uint)bVar81 * auVar99._20_4_ | (uint)!bVar81 * auVar100._20_4_;
            bVar81 = (bool)((byte)(uVar17 >> 6) & 1);
            uVar141 = (uint)bVar81 * auVar99._24_4_ | (uint)!bVar81 * auVar100._24_4_;
            bVar81 = SUB81(uVar17 >> 7,0);
            uVar142 = (uint)bVar81 * auVar99._28_4_ | (uint)!bVar81 * auVar100._28_4_;
            auVar129._0_4_ = (bVar76 & 1) * uVar84 | !(bool)(bVar76 & 1) * auVar129._0_4_;
            bVar81 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar129._4_4_ = bVar81 * uVar136 | !bVar81 * auVar129._4_4_;
            bVar81 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar129._8_4_ = bVar81 * uVar137 | !bVar81 * auVar129._8_4_;
            bVar81 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar129._12_4_ = bVar81 * uVar138 | !bVar81 * auVar129._12_4_;
            bVar81 = (bool)((byte)(uVar83 >> 4) & 1);
            auVar129._16_4_ = bVar81 * uVar139 | !bVar81 * auVar129._16_4_;
            bVar81 = (bool)((byte)(uVar83 >> 5) & 1);
            auVar129._20_4_ = bVar81 * uVar140 | !bVar81 * auVar129._20_4_;
            bVar81 = (bool)((byte)(uVar83 >> 6) & 1);
            auVar129._24_4_ = bVar81 * uVar141 | !bVar81 * auVar129._24_4_;
            bVar81 = SUB81(uVar83 >> 7,0);
            auVar129._28_4_ = bVar81 * uVar142 | !bVar81 * auVar129._28_4_;
            auVar99 = vblendmps_avx512vl(auVar244,auVar241);
            bVar81 = (bool)((byte)(uVar17 >> 1) & 1);
            bVar10 = (bool)((byte)(uVar17 >> 2) & 1);
            bVar11 = (bool)((byte)(uVar17 >> 3) & 1);
            bVar12 = (bool)((byte)(uVar17 >> 4) & 1);
            bVar13 = (bool)((byte)(uVar17 >> 5) & 1);
            bVar14 = (bool)((byte)(uVar17 >> 6) & 1);
            bVar15 = SUB81(uVar17 >> 7,0);
            auVar130._0_4_ =
                 (uint)(bVar76 & 1) *
                 ((uint)(bVar78 & 1) * auVar99._0_4_ | !(bool)(bVar78 & 1) * uVar84) |
                 !(bool)(bVar76 & 1) * auVar130._0_4_;
            bVar9 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar130._4_4_ =
                 (uint)bVar9 * ((uint)bVar81 * auVar99._4_4_ | !bVar81 * uVar136) |
                 !bVar9 * auVar130._4_4_;
            bVar81 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar130._8_4_ =
                 (uint)bVar81 * ((uint)bVar10 * auVar99._8_4_ | !bVar10 * uVar137) |
                 !bVar81 * auVar130._8_4_;
            bVar81 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar130._12_4_ =
                 (uint)bVar81 * ((uint)bVar11 * auVar99._12_4_ | !bVar11 * uVar138) |
                 !bVar81 * auVar130._12_4_;
            bVar81 = (bool)((byte)(uVar83 >> 4) & 1);
            auVar130._16_4_ =
                 (uint)bVar81 * ((uint)bVar12 * auVar99._16_4_ | !bVar12 * uVar139) |
                 !bVar81 * auVar130._16_4_;
            bVar81 = (bool)((byte)(uVar83 >> 5) & 1);
            auVar130._20_4_ =
                 (uint)bVar81 * ((uint)bVar13 * auVar99._20_4_ | !bVar13 * uVar140) |
                 !bVar81 * auVar130._20_4_;
            bVar81 = (bool)((byte)(uVar83 >> 6) & 1);
            auVar130._24_4_ =
                 (uint)bVar81 * ((uint)bVar14 * auVar99._24_4_ | !bVar14 * uVar141) |
                 !bVar81 * auVar130._24_4_;
            bVar81 = SUB81(uVar83 >> 7,0);
            auVar130._28_4_ =
                 (uint)bVar81 * ((uint)bVar15 * auVar99._28_4_ | !bVar15 * uVar142) |
                 !bVar81 * auVar130._28_4_;
            uVar82 = (ulong)(byte)((~bVar76 | bVar78) & (byte)uVar82);
          }
        }
        auVar269 = ZEXT3264(local_8e0);
        auVar261 = ZEXT3264(local_900);
        auVar262 = ZEXT3264(local_920);
        auVar263 = ZEXT3264(local_940);
        auVar265 = ZEXT3264(local_960);
        auVar267 = ZEXT3264(local_980);
        auVar273 = ZEXT3264(local_9a0);
        auVar257 = ZEXT3264(local_440);
        auVar236._0_4_ = local_440._0_4_ * auVar184._0_4_;
        auVar236._4_4_ = local_440._4_4_ * auVar184._4_4_;
        auVar236._8_4_ = local_440._8_4_ * auVar184._8_4_;
        auVar236._12_4_ = local_440._12_4_ * auVar184._12_4_;
        auVar236._16_4_ = local_440._16_4_ * auVar184._16_4_;
        auVar236._20_4_ = local_440._20_4_ * auVar184._20_4_;
        auVar236._28_36_ = auVar184._28_36_;
        auVar236._24_4_ = local_440._24_4_ * auVar184._24_4_;
        auVar245 = ZEXT3264(local_420);
        auVar86 = vfmadd231ps_fma(auVar236._0_32_,local_420,auVar98);
        auVar242 = ZEXT3264(local_400);
        auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),local_400,auVar97);
        auVar240._8_4_ = 0x7fffffff;
        auVar240._0_8_ = 0x7fffffff7fffffff;
        auVar240._12_4_ = 0x7fffffff;
        auVar240._16_4_ = 0x7fffffff;
        auVar240._20_4_ = 0x7fffffff;
        auVar240._24_4_ = 0x7fffffff;
        auVar240._28_4_ = 0x7fffffff;
        auVar99 = vandps_avx(ZEXT1632(auVar86),auVar240);
        auVar252 = ZEXT3264(_local_720);
        _local_1c0 = _local_720;
        auVar235._8_4_ = 0x3e99999a;
        auVar235._0_8_ = 0x3e99999a3e99999a;
        auVar235._12_4_ = 0x3e99999a;
        auVar235._16_4_ = 0x3e99999a;
        auVar235._20_4_ = 0x3e99999a;
        auVar235._24_4_ = 0x3e99999a;
        auVar235._28_4_ = 0x3e99999a;
        uVar16 = vcmpps_avx512vl(auVar99,auVar235,1);
        local_3e0._0_2_ = (short)uVar16;
        auVar99 = vmaxps_avx(_local_720,auVar130);
        local_360 = auVar99;
        auVar98 = vminps_avx(local_340,auVar129);
        uVar16 = vcmpps_avx512vl(_local_720,auVar98,2);
        bVar76 = (byte)uVar16 & bVar72;
        uVar18 = vcmpps_avx512vl(auVar99,local_340,2);
        auVar264 = ZEXT3264(local_800);
        auVar266 = ZEXT3264(local_820);
        if ((bVar72 & ((byte)uVar18 | (byte)uVar16)) == 0) {
          auVar236 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                                                                                                                  
                                                  0x3f8000003f800000)))))));
        }
        else {
          uVar83 = CONCAT71((int7)(uVar82 >> 8),~(byte)uVar82);
          auVar64._4_4_ = local_440._4_4_ * auVar250._4_4_;
          auVar64._0_4_ = local_440._0_4_ * auVar250._0_4_;
          auVar64._8_4_ = local_440._8_4_ * auVar250._8_4_;
          auVar64._12_4_ = local_440._12_4_ * auVar250._12_4_;
          auVar64._16_4_ = local_440._16_4_ * auVar250._16_4_;
          auVar64._20_4_ = local_440._20_4_ * auVar250._20_4_;
          auVar64._24_4_ = local_440._24_4_ * auVar250._24_4_;
          auVar64._28_4_ = auVar98._28_4_;
          auVar86 = vfmadd213ps_fma(auVar107,local_420,auVar64);
          auVar86 = vfmadd213ps_fma(auVar103,local_400,ZEXT1632(auVar86));
          auVar98 = vandps_avx(ZEXT1632(auVar86),auVar240);
          uVar16 = vcmpps_avx512vl(auVar98,auVar235,1);
          bVar78 = (byte)uVar16 | ~(byte)uVar82;
          auVar155._8_4_ = 2;
          auVar155._0_8_ = 0x200000002;
          auVar155._12_4_ = 2;
          auVar155._16_4_ = 2;
          auVar155._20_4_ = 2;
          auVar155._24_4_ = 2;
          auVar155._28_4_ = 2;
          auVar35._8_4_ = 3;
          auVar35._0_8_ = 0x300000003;
          auVar35._12_4_ = 3;
          auVar35._16_4_ = 3;
          auVar35._20_4_ = 3;
          auVar35._24_4_ = 3;
          auVar35._28_4_ = 3;
          auVar98 = vpblendmd_avx512vl(auVar155,auVar35);
          local_300._0_4_ = (uint)(bVar78 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar78 & 1) * 2;
          bVar81 = (bool)(bVar78 >> 1 & 1);
          local_300._4_4_ = (uint)bVar81 * auVar98._4_4_ | (uint)!bVar81 * 2;
          bVar81 = (bool)(bVar78 >> 2 & 1);
          local_300._8_4_ = (uint)bVar81 * auVar98._8_4_ | (uint)!bVar81 * 2;
          bVar81 = (bool)(bVar78 >> 3 & 1);
          local_300._12_4_ = (uint)bVar81 * auVar98._12_4_ | (uint)!bVar81 * 2;
          bVar81 = (bool)(bVar78 >> 4 & 1);
          local_300._16_4_ = (uint)bVar81 * auVar98._16_4_ | (uint)!bVar81 * 2;
          bVar81 = (bool)(bVar78 >> 5 & 1);
          local_300._20_4_ = (uint)bVar81 * auVar98._20_4_ | (uint)!bVar81 * 2;
          bVar81 = (bool)(bVar78 >> 6 & 1);
          local_300._24_4_ = (uint)bVar81 * auVar98._24_4_ | (uint)!bVar81 * 2;
          local_300._28_4_ = (uint)(bVar78 >> 7) * auVar98._28_4_ | (uint)!(bool)(bVar78 >> 7) * 2;
          local_380 = vpbroadcastd_avx512vl();
          uVar16 = vpcmpd_avx512vl(local_380,local_300,5);
          bVar78 = (byte)uVar16 & bVar76;
          auVar236 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                                                                                                                  
                                                  0x3f8000003f800000)))))));
          if (bVar78 == 0) {
            auVar157._4_4_ = uVar85;
            auVar157._0_4_ = uVar85;
            auVar157._8_4_ = uVar85;
            auVar157._12_4_ = uVar85;
            auVar157._16_4_ = uVar85;
            auVar157._20_4_ = uVar85;
            auVar157._24_4_ = uVar85;
            auVar157._28_4_ = uVar85;
          }
          else {
            local_320 = auVar99;
            local_9d0 = (uint)uVar83;
            auVar88 = vminps_avx(local_640._0_16_,local_680._0_16_);
            auVar86 = vmaxps_avx(local_640._0_16_,local_680._0_16_);
            auVar89 = vminps_avx(local_660._0_16_,local_6a0._0_16_);
            auVar93 = vminps_avx(auVar88,auVar89);
            auVar88 = vmaxps_avx(local_660._0_16_,local_6a0._0_16_);
            auVar89 = vmaxps_avx(auVar86,auVar88);
            auVar187._8_4_ = 0x7fffffff;
            auVar187._0_8_ = 0x7fffffff7fffffff;
            auVar187._12_4_ = 0x7fffffff;
            auVar86 = vandps_avx(auVar93,auVar187);
            auVar88 = vandps_avx(auVar89,auVar187);
            auVar86 = vmaxps_avx(auVar86,auVar88);
            auVar88 = vmovshdup_avx(auVar86);
            auVar88 = vmaxss_avx(auVar88,auVar86);
            auVar86 = vshufpd_avx(auVar86,auVar86,1);
            auVar86 = vmaxss_avx(auVar86,auVar88);
            fVar213 = auVar86._0_4_ * 1.9073486e-06;
            local_600 = vshufps_avx(auVar89,auVar89,0xff);
            local_3c0 = (float)local_720._0_4_ + (float)local_9c0._0_4_;
            fStack_3bc = (float)local_720._4_4_ + (float)local_9c0._4_4_;
            fStack_3b8 = fStack_718 + fStack_9b8;
            fStack_3b4 = fStack_714 + fStack_9b4;
            fStack_3b0 = fStack_710 + fStack_9b0;
            fStack_3ac = fStack_70c + fStack_9ac;
            fStack_3a8 = fStack_708 + fStack_9a8;
            fStack_3a4 = fStack_704 + fStack_9a4;
            do {
              auVar156._8_4_ = 0x7f800000;
              auVar156._0_8_ = 0x7f8000007f800000;
              auVar156._12_4_ = 0x7f800000;
              auVar156._16_4_ = 0x7f800000;
              auVar156._20_4_ = 0x7f800000;
              auVar156._24_4_ = 0x7f800000;
              auVar156._28_4_ = 0x7f800000;
              auVar99 = vblendmps_avx512vl(auVar156,_local_720);
              auVar132._0_4_ =
                   (uint)(bVar78 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar78 & 1) * 0x7f800000;
              bVar81 = (bool)(bVar78 >> 1 & 1);
              auVar132._4_4_ = (uint)bVar81 * auVar99._4_4_ | (uint)!bVar81 * 0x7f800000;
              bVar81 = (bool)(bVar78 >> 2 & 1);
              auVar132._8_4_ = (uint)bVar81 * auVar99._8_4_ | (uint)!bVar81 * 0x7f800000;
              bVar81 = (bool)(bVar78 >> 3 & 1);
              auVar132._12_4_ = (uint)bVar81 * auVar99._12_4_ | (uint)!bVar81 * 0x7f800000;
              bVar81 = (bool)(bVar78 >> 4 & 1);
              auVar132._16_4_ = (uint)bVar81 * auVar99._16_4_ | (uint)!bVar81 * 0x7f800000;
              bVar81 = (bool)(bVar78 >> 5 & 1);
              auVar132._20_4_ = (uint)bVar81 * auVar99._20_4_ | (uint)!bVar81 * 0x7f800000;
              auVar132._24_4_ =
                   (uint)(bVar78 >> 6) * auVar99._24_4_ | (uint)!(bool)(bVar78 >> 6) * 0x7f800000;
              auVar132._28_4_ = 0x7f800000;
              auVar99 = vshufps_avx(auVar132,auVar132,0xb1);
              auVar99 = vminps_avx(auVar132,auVar99);
              auVar98 = vshufpd_avx(auVar99,auVar99,5);
              auVar99 = vminps_avx(auVar99,auVar98);
              auVar98 = vpermpd_avx2(auVar99,0x4e);
              auVar99 = vminps_avx(auVar99,auVar98);
              uVar16 = vcmpps_avx512vl(auVar132,auVar99,0);
              bVar73 = (byte)uVar16 & bVar78;
              bVar74 = bVar78;
              if (bVar73 != 0) {
                bVar74 = bVar73;
              }
              iVar20 = 0;
              for (uVar85 = (uint)bVar74; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x80000000) {
                iVar20 = iVar20 + 1;
              }
              auVar184 = ZEXT464(*(uint *)(local_1e0 + (uint)(iVar20 << 2)));
              auVar245 = ZEXT464(*(uint *)(local_1c0 + (uint)(iVar20 << 2)));
              fVar231 = local_9c8;
              if ((float)local_6c0._0_4_ < 0.0) {
                local_8a0._0_16_ = ZEXT416(*(uint *)(local_1e0 + (uint)(iVar20 << 2)));
                local_7a0._0_16_ = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar20 << 2)));
                fVar231 = sqrtf((float)local_6c0._0_4_);
                auVar245 = ZEXT1664(local_7a0._0_16_);
                auVar184 = ZEXT1664(local_8a0._0_16_);
              }
              bVar81 = true;
              uVar82 = 0;
              do {
                local_7a0._0_16_ = auVar245._0_16_;
                uVar166 = auVar245._0_4_;
                auVar146._4_4_ = uVar166;
                auVar146._0_4_ = uVar166;
                auVar146._8_4_ = uVar166;
                auVar146._12_4_ = uVar166;
                auVar86 = vfmadd132ps_fma(auVar146,ZEXT816(0) << 0x40,local_6b0);
                fVar248 = auVar184._0_4_;
                fVar221 = 1.0 - fVar248;
                fVar247 = fVar221 * fVar221 * fVar221;
                fVar243 = fVar248 * fVar248;
                fVar220 = fVar248 * fVar243;
                auVar88 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar247),
                                          ZEXT416((uint)fVar220));
                fVar246 = fVar248 * fVar221;
                auVar223 = ZEXT416((uint)fVar221);
                auVar93 = vfmadd231ss_fma(ZEXT416((uint)(fVar248 * fVar246 * 6.0)),
                                          ZEXT416((uint)(fVar246 * fVar221)),
                                          SUB6416(ZEXT464(0x41400000),0));
                auVar89 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar220),
                                          ZEXT416((uint)fVar247));
                auVar2 = vfmadd231ss_fma(ZEXT416((uint)(fVar246 * fVar221 * 6.0)),
                                         SUB6416(ZEXT464(0x41400000),0),
                                         ZEXT416((uint)(fVar248 * fVar246)));
                fVar247 = fVar247 * 0.16666667;
                fVar248 = (auVar88._0_4_ + auVar93._0_4_) * 0.16666667;
                fVar219 = (auVar89._0_4_ + auVar2._0_4_) * 0.16666667;
                fVar220 = fVar220 * 0.16666667;
                auVar188._0_4_ = fVar220 * (float)local_6a0._0_4_;
                auVar188._4_4_ = fVar220 * (float)local_6a0._4_4_;
                auVar188._8_4_ = fVar220 * fStack_698;
                auVar188._12_4_ = fVar220 * fStack_694;
                auVar224._4_4_ = fVar219;
                auVar224._0_4_ = fVar219;
                auVar224._8_4_ = fVar219;
                auVar224._12_4_ = fVar219;
                auVar88 = vfmadd132ps_fma(auVar224,auVar188,local_660._0_16_);
                auVar189._4_4_ = fVar248;
                auVar189._0_4_ = fVar248;
                auVar189._8_4_ = fVar248;
                auVar189._12_4_ = fVar248;
                auVar88 = vfmadd132ps_fma(auVar189,auVar88,local_680._0_16_);
                auVar169._4_4_ = fVar247;
                auVar169._0_4_ = fVar247;
                auVar169._8_4_ = fVar247;
                auVar169._12_4_ = fVar247;
                auVar88 = vfmadd132ps_fma(auVar169,auVar88,local_640._0_16_);
                local_540._0_16_ = auVar88;
                auVar86 = vsubps_avx(auVar86,auVar88);
                local_6e0._0_16_ = auVar86;
                auVar86 = vdpps_avx(auVar86,auVar86,0x7f);
                local_8a0._0_16_ = auVar184._0_16_;
                local_700._0_16_ = auVar86;
                if (auVar86._0_4_ < 0.0) {
                  local_7c0._0_4_ = fVar243;
                  local_7e0._0_4_ = fVar246;
                  auVar242._0_4_ = sqrtf(auVar86._0_4_);
                  auVar242._4_60_ = extraout_var;
                  auVar86 = auVar242._0_16_;
                  fVar246 = (float)local_7e0._0_4_;
                  auVar88 = local_8a0._0_16_;
                }
                else {
                  auVar86 = vsqrtss_avx(auVar86,auVar86);
                  local_7c0._0_4_ = fVar243;
                  auVar88 = auVar184._0_16_;
                }
                local_560._4_4_ = fVar221;
                local_560._0_4_ = fVar221;
                fStack_558 = fVar221;
                fStack_554 = fVar221;
                auVar89 = vfnmsub213ss_fma(auVar88,auVar88,ZEXT416((uint)(fVar246 * 4.0)));
                auVar88 = vfmadd231ss_fma(ZEXT416((uint)(fVar246 * 4.0)),auVar223,auVar223);
                fVar243 = fVar221 * -fVar221 * 0.5;
                fVar246 = auVar89._0_4_ * 0.5;
                fVar247 = auVar88._0_4_ * 0.5;
                local_7c0._0_4_ = (float)local_7c0._0_4_ * 0.5;
                auVar215._0_4_ = (float)local_7c0._0_4_ * (float)local_6a0._0_4_;
                auVar215._4_4_ = (float)local_7c0._0_4_ * (float)local_6a0._4_4_;
                auVar215._8_4_ = (float)local_7c0._0_4_ * fStack_698;
                auVar215._12_4_ = (float)local_7c0._0_4_ * fStack_694;
                auVar170._4_4_ = fVar247;
                auVar170._0_4_ = fVar247;
                auVar170._8_4_ = fVar247;
                auVar170._12_4_ = fVar247;
                auVar88 = vfmadd132ps_fma(auVar170,auVar215,local_660._0_16_);
                auVar190._4_4_ = fVar246;
                auVar190._0_4_ = fVar246;
                auVar190._8_4_ = fVar246;
                auVar190._12_4_ = fVar246;
                auVar88 = vfmadd132ps_fma(auVar190,auVar88,local_680._0_16_);
                auVar254._4_4_ = fVar243;
                auVar254._0_4_ = fVar243;
                auVar254._8_4_ = fVar243;
                auVar254._12_4_ = fVar243;
                _local_7c0 = vfmadd132ps_fma(auVar254,auVar88,local_640._0_16_);
                local_580._0_16_ = vdpps_avx(_local_7c0,_local_7c0,0x7f);
                auVar66._12_4_ = 0;
                auVar66._0_12_ = ZEXT812(0);
                fVar243 = local_580._0_4_;
                auVar88 = vrsqrt14ss_avx512f(auVar66 << 0x20,ZEXT416((uint)fVar243));
                fVar246 = auVar88._0_4_;
                local_5a0._0_16_ = vrcp14ss_avx512f(auVar66 << 0x20,ZEXT416((uint)fVar243));
                auVar88 = vfnmadd213ss_fma(local_5a0._0_16_,local_580._0_16_,ZEXT416(0x40000000));
                local_770._0_4_ = auVar88._0_4_;
                local_7e0._0_4_ = auVar86._0_4_;
                if (fVar243 < -fVar243) {
                  auVar245._0_4_ = sqrtf(fVar243);
                  auVar245._4_60_ = extraout_var_00;
                  auVar86 = ZEXT416((uint)local_7e0._0_4_);
                  auVar89 = auVar245._0_16_;
                  auVar88 = _local_7c0;
                }
                else {
                  auVar89 = vsqrtss_avx512f(local_580._0_16_,local_580._0_16_);
                  auVar88 = _local_7c0;
                }
                fVar243 = fVar246 * 1.5 + fVar243 * -0.5 * fVar246 * fVar246 * fVar246;
                auVar147._0_4_ = auVar88._0_4_ * fVar243;
                auVar147._4_4_ = auVar88._4_4_ * fVar243;
                auVar147._8_4_ = auVar88._8_4_ * fVar243;
                auVar147._12_4_ = auVar88._12_4_ * fVar243;
                auVar93 = vdpps_avx(local_6e0._0_16_,auVar147,0x7f);
                fVar247 = auVar86._0_4_;
                auVar148._0_4_ = auVar93._0_4_ * auVar93._0_4_;
                auVar148._4_4_ = auVar93._4_4_ * auVar93._4_4_;
                auVar148._8_4_ = auVar93._8_4_ * auVar93._8_4_;
                auVar148._12_4_ = auVar93._12_4_ * auVar93._12_4_;
                auVar2 = vsubps_avx(local_700._0_16_,auVar148);
                fVar246 = auVar2._0_4_;
                auVar171._4_12_ = ZEXT812(0) << 0x20;
                auVar171._0_4_ = fVar246;
                auVar90 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar171);
                auVar87 = vmulss_avx512f(auVar90,ZEXT416(0x3fc00000));
                if (fVar246 < 0.0) {
                  local_5d0._0_4_ = auVar87._0_4_;
                  local_5f0 = fVar243;
                  fStack_5ec = fVar243;
                  fStack_5e8 = fVar243;
                  fStack_5e4 = fVar243;
                  local_5e0 = auVar90;
                  local_5c0 = auVar93;
                  fVar232 = sqrtf(fVar246);
                  auVar87 = ZEXT416((uint)local_5d0._0_4_);
                  auVar89 = ZEXT416(auVar89._0_4_);
                  auVar86 = ZEXT416((uint)local_7e0._0_4_);
                  auVar88 = _local_7c0;
                  auVar93 = local_5c0;
                  auVar90 = local_5e0;
                  fVar243 = local_5f0;
                  fVar248 = fStack_5ec;
                  fVar219 = fStack_5e8;
                  fVar220 = fStack_5e4;
                }
                else {
                  auVar2 = vsqrtss_avx(auVar2,auVar2);
                  fVar232 = auVar2._0_4_;
                  fVar248 = fVar243;
                  fVar219 = fVar243;
                  fVar220 = fVar243;
                }
                auVar257 = ZEXT1664(auVar88);
                auVar252 = ZEXT1664(local_700._0_16_);
                auVar249 = ZEXT1664(local_6e0._0_16_);
                auVar269 = ZEXT3264(local_8e0);
                auVar261 = ZEXT3264(local_900);
                auVar262 = ZEXT3264(local_920);
                auVar263 = ZEXT3264(local_940);
                auVar264 = ZEXT3264(local_800);
                auVar265 = ZEXT3264(local_960);
                auVar266 = ZEXT3264(local_820);
                auVar267 = ZEXT3264(local_980);
                auVar268 = ZEXT3264(local_840);
                auVar270 = ZEXT3264(local_860);
                auVar271 = ZEXT3264(local_880);
                auVar272 = ZEXT3264(local_8c0);
                auVar273 = ZEXT3264(local_9a0);
                auVar92 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar223,local_8a0._0_16_);
                auVar2 = vfmadd231ss_fma(auVar223,local_8a0._0_16_,SUB6416(ZEXT464(0xc0000000),0));
                fVar233 = local_8a0._0_4_;
                auVar191._0_4_ = fVar233 * (float)local_6a0._0_4_;
                auVar191._4_4_ = fVar233 * (float)local_6a0._4_4_;
                auVar191._8_4_ = fVar233 * fStack_698;
                auVar191._12_4_ = fVar233 * fStack_694;
                auVar216._0_4_ = auVar2._0_4_;
                auVar216._4_4_ = auVar216._0_4_;
                auVar216._8_4_ = auVar216._0_4_;
                auVar216._12_4_ = auVar216._0_4_;
                auVar2 = vfmadd132ps_fma(auVar216,auVar191,local_660._0_16_);
                auVar172._0_4_ = auVar92._0_4_;
                auVar172._4_4_ = auVar172._0_4_;
                auVar172._8_4_ = auVar172._0_4_;
                auVar172._12_4_ = auVar172._0_4_;
                auVar2 = vfmadd132ps_fma(auVar172,auVar2,local_680._0_16_);
                auVar2 = vfmadd132ps_fma(_local_560,auVar2,local_640._0_16_);
                auVar173._0_4_ = auVar2._0_4_ * (float)local_580._0_4_;
                auVar173._4_4_ = auVar2._4_4_ * (float)local_580._0_4_;
                auVar173._8_4_ = auVar2._8_4_ * (float)local_580._0_4_;
                auVar173._12_4_ = auVar2._12_4_ * (float)local_580._0_4_;
                auVar2 = vdpps_avx(auVar88,auVar2,0x7f);
                fVar221 = auVar2._0_4_;
                auVar192._0_4_ = auVar88._0_4_ * fVar221;
                auVar192._4_4_ = auVar88._4_4_ * fVar221;
                auVar192._8_4_ = auVar88._8_4_ * fVar221;
                auVar192._12_4_ = auVar88._12_4_ * fVar221;
                auVar2 = vsubps_avx(auVar173,auVar192);
                fVar221 = (float)local_770._0_4_ * (float)local_5a0._0_4_;
                auVar21._8_4_ = 0x80000000;
                auVar21._0_8_ = 0x8000000080000000;
                auVar21._12_4_ = 0x80000000;
                auVar91 = vxorps_avx512vl(auVar88,auVar21);
                auVar225._0_4_ = fVar243 * auVar2._0_4_ * fVar221;
                auVar225._4_4_ = fVar248 * auVar2._4_4_ * fVar221;
                auVar225._8_4_ = fVar219 * auVar2._8_4_ * fVar221;
                auVar225._12_4_ = fVar220 * auVar2._12_4_ * fVar221;
                auVar2 = vdpps_avx(auVar91,auVar147,0x7f);
                auVar223 = vmaxss_avx(ZEXT416((uint)fVar213),
                                      ZEXT416((uint)((float)local_7a0._0_4_ *
                                                    fVar231 * 1.9073486e-06)));
                auVar92 = vdivss_avx512f(ZEXT416((uint)fVar213),auVar89);
                auVar89 = vdpps_avx(local_6e0._0_16_,auVar225,0x7f);
                auVar86 = vfmadd213ss_fma(auVar86,ZEXT416((uint)fVar213),auVar223);
                auVar92 = vfmadd213ss_fma(ZEXT416((uint)(fVar247 + 1.0)),auVar92,auVar86);
                auVar86 = vdpps_avx(local_6b0,auVar147,0x7f);
                fVar243 = auVar2._0_4_ + auVar89._0_4_;
                auVar89 = vdpps_avx(local_6e0._0_16_,auVar91,0x7f);
                auVar91 = vmulss_avx512f(auVar90,ZEXT416((uint)(fVar246 * -0.5)));
                auVar90 = vmulss_avx512f(auVar90,auVar90);
                auVar2 = vdpps_avx(local_6e0._0_16_,local_6b0,0x7f);
                auVar91 = vaddss_avx512f(auVar87,ZEXT416((uint)(auVar91._0_4_ * auVar90._0_4_)));
                auVar90 = vfnmadd231ss_fma(auVar89,auVar93,ZEXT416((uint)fVar243));
                auVar87 = vfnmadd231ss_fma(auVar2,auVar93,auVar86);
                auVar89 = vpermilps_avx(local_540._0_16_,0xff);
                fVar232 = fVar232 - auVar89._0_4_;
                auVar89 = vshufps_avx(auVar88,auVar88,0xff);
                auVar2 = vfmsub213ss_fma(auVar90,auVar91,auVar89);
                fVar246 = auVar87._0_4_ * auVar91._0_4_;
                auVar90 = vfmsub231ss_fma(ZEXT416((uint)(auVar86._0_4_ * auVar2._0_4_)),
                                          ZEXT416((uint)fVar243),ZEXT416((uint)fVar246));
                fVar247 = auVar90._0_4_;
                fVar233 = fVar233 - (auVar93._0_4_ * (fVar246 / fVar247) -
                                    fVar232 * (auVar86._0_4_ / fVar247));
                auVar184 = ZEXT464((uint)fVar233);
                fVar144 = (float)local_7a0._0_4_ -
                          (fVar232 * (fVar243 / fVar247) - auVar93._0_4_ * (auVar2._0_4_ / fVar247))
                ;
                auVar245 = ZEXT464((uint)fVar144);
                auVar22._8_4_ = 0x7fffffff;
                auVar22._0_8_ = 0x7fffffff7fffffff;
                auVar22._12_4_ = 0x7fffffff;
                auVar86 = vandps_avx512vl(auVar93,auVar22);
                fVar243 = (float)local_9c0._0_4_;
                fVar246 = (float)local_9c0._4_4_;
                fVar247 = fStack_9b8;
                fVar248 = fStack_9b4;
                fVar219 = fStack_9b0;
                fVar220 = fStack_9ac;
                fVar221 = fStack_9a8;
                fVar164 = fStack_9a4;
                if (auVar86._0_4_ < auVar92._0_4_) {
                  auVar86 = vfmadd231ss_fma(ZEXT416((uint)(auVar92._0_4_ + auVar223._0_4_)),
                                            local_600,ZEXT416(0x36000000));
                  auVar23._8_4_ = 0x7fffffff;
                  auVar23._0_8_ = 0x7fffffff7fffffff;
                  auVar23._12_4_ = 0x7fffffff;
                  auVar93 = vandps_avx512vl(ZEXT416((uint)fVar232),auVar23);
                  if (auVar93._0_4_ < auVar86._0_4_) {
                    fVar231 = fVar144 + (float)local_610._0_4_;
                    auVar236 = ZEXT3264(CONCAT428(0x3f800000,
                                                  CONCAT424(0x3f800000,
                                                            CONCAT420(0x3f800000,
                                                                      CONCAT416(0x3f800000,
                                                                                CONCAT412(0x3f800000
                                                                                          ,CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
                    if (fVar143 <= fVar231) {
                      fVar232 = *(float *)(ray + k * 4 + 0x80);
                      bVar74 = 0;
                      if (((fVar232 < fVar231) || (fVar233 < 0.0)) || (bVar74 = 0, 1.0 < fVar233))
                      goto LAB_01dfc618;
                      auVar193._4_12_ = SUB1612(ZEXT816(0),0);
                      auVar193._0_4_ = local_700._0_4_;
                      auVar86 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar193);
                      fVar159 = auVar86._0_4_;
                      pGVar4 = (context->scene->geometries).items[local_758].ptr;
                      if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (bVar74 = 1, pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0))
                        goto LAB_01dfc618;
                        fVar159 = fVar159 * 1.5 +
                                  local_700._0_4_ * -0.5 * fVar159 * fVar159 * fVar159;
                        auVar194._0_4_ = local_6e0._0_4_ * fVar159;
                        auVar194._4_4_ = local_6e0._4_4_ * fVar159;
                        auVar194._8_4_ = local_6e0._8_4_ * fVar159;
                        auVar194._12_4_ = local_6e0._12_4_ * fVar159;
                        auVar2 = vfmadd213ps_fma(auVar89,auVar194,auVar88);
                        auVar86 = vshufps_avx(auVar194,auVar194,0xc9);
                        auVar89 = vshufps_avx(auVar88,auVar88,0xc9);
                        auVar195._0_4_ = auVar194._0_4_ * auVar89._0_4_;
                        auVar195._4_4_ = auVar194._4_4_ * auVar89._4_4_;
                        auVar195._8_4_ = auVar194._8_4_ * auVar89._8_4_;
                        auVar195._12_4_ = auVar194._12_4_ * auVar89._12_4_;
                        auVar93 = vfmsub231ps_fma(auVar195,auVar88,auVar86);
                        auVar86 = vshufps_avx(auVar93,auVar93,0xc9);
                        auVar89 = vshufps_avx(auVar2,auVar2,0xc9);
                        auVar93 = vshufps_avx(auVar93,auVar93,0xd2);
                        auVar149._0_4_ = auVar2._0_4_ * auVar93._0_4_;
                        auVar149._4_4_ = auVar2._4_4_ * auVar93._4_4_;
                        auVar149._8_4_ = auVar2._8_4_ * auVar93._8_4_;
                        auVar149._12_4_ = auVar2._12_4_ * auVar93._12_4_;
                        auVar86 = vfmsub231ps_fma(auVar149,auVar86,auVar89);
                        local_4e0 = (RTCHitN  [16])vshufps_avx(auVar86,auVar86,0x55);
                        auStack_4d0 = vshufps_avx(auVar86,auVar86,0xaa);
                        local_4c0 = auVar86._0_4_;
                        uStack_4bc = local_4c0;
                        uStack_4b8 = local_4c0;
                        uStack_4b4 = local_4c0;
                        local_4b0 = fVar233;
                        fStack_4ac = fVar233;
                        fStack_4a8 = fVar233;
                        fStack_4a4 = fVar233;
                        local_4a0 = ZEXT416(0) << 0x20;
                        local_490 = local_4f0._0_8_;
                        uStack_488 = local_4f0._8_8_;
                        local_480 = local_500;
                        vpcmpeqd_avx2(ZEXT1632(local_500),ZEXT1632(local_500));
                        uStack_46c = context->user->instID[0];
                        local_470 = uStack_46c;
                        uStack_468 = uStack_46c;
                        uStack_464 = uStack_46c;
                        uStack_460 = context->user->instPrimID[0];
                        uStack_45c = uStack_460;
                        uStack_458 = uStack_460;
                        uStack_454 = uStack_460;
                        *(float *)(ray + k * 4 + 0x80) = fVar231;
                        local_9e0 = local_510;
                        local_750.valid = (int *)local_9e0;
                        local_750.geometryUserPtr = pGVar4->userPtr;
                        local_750.context = context->user;
                        local_750.hit = local_4e0;
                        local_750.N = 4;
                        local_750.ray = (RTCRayN *)ray;
                        if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar245 = ZEXT464((uint)fVar144);
                          auVar249 = ZEXT1664(local_6e0._0_16_);
                          auVar252 = ZEXT1664(local_700._0_16_);
                          auVar257 = ZEXT1664(auVar88);
                          (*pGVar4->occlusionFilterN)(&local_750);
                          auVar273 = ZEXT3264(local_9a0);
                          auVar272 = ZEXT3264(local_8c0);
                          auVar271 = ZEXT3264(local_880);
                          auVar270 = ZEXT3264(local_860);
                          auVar268 = ZEXT3264(local_840);
                          auVar267 = ZEXT3264(local_980);
                          auVar266 = ZEXT3264(local_820);
                          auVar265 = ZEXT3264(local_960);
                          auVar264 = ZEXT3264(local_800);
                          auVar263 = ZEXT3264(local_940);
                          auVar262 = ZEXT3264(local_920);
                          auVar261 = ZEXT3264(local_900);
                          auVar269 = ZEXT3264(local_8e0);
                          auVar236 = ZEXT3264(CONCAT428(0x3f800000,
                                                        CONCAT424(0x3f800000,
                                                                  CONCAT420(0x3f800000,
                                                                            CONCAT416(0x3f800000,
                                                                                      CONCAT412(
                                                  0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)
                                                  ))))));
                          fVar243 = (float)local_9c0._0_4_;
                          fVar246 = (float)local_9c0._4_4_;
                          fVar247 = fStack_9b8;
                          fVar248 = fStack_9b4;
                          fVar219 = fStack_9b0;
                          fVar220 = fStack_9ac;
                          fVar221 = fStack_9a8;
                          fVar164 = fStack_9a4;
                        }
                        uVar82 = vptestmd_avx512vl(local_9e0,local_9e0);
                        if ((uVar82 & 0xf) != 0) {
                          p_Var8 = context->args->filter;
                          if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar245 = ZEXT1664(auVar245._0_16_);
                            auVar249 = ZEXT1664(auVar249._0_16_);
                            auVar252 = ZEXT1664(auVar252._0_16_);
                            auVar257 = ZEXT1664(auVar257._0_16_);
                            (*p_Var8)(&local_750);
                            auVar273 = ZEXT3264(local_9a0);
                            auVar272 = ZEXT3264(local_8c0);
                            auVar271 = ZEXT3264(local_880);
                            auVar270 = ZEXT3264(local_860);
                            auVar268 = ZEXT3264(local_840);
                            auVar267 = ZEXT3264(local_980);
                            auVar266 = ZEXT3264(local_820);
                            auVar265 = ZEXT3264(local_960);
                            auVar264 = ZEXT3264(local_800);
                            auVar263 = ZEXT3264(local_940);
                            auVar262 = ZEXT3264(local_920);
                            auVar261 = ZEXT3264(local_900);
                            auVar269 = ZEXT3264(local_8e0);
                            auVar236 = ZEXT3264(CONCAT428(0x3f800000,
                                                          CONCAT424(0x3f800000,
                                                                    CONCAT420(0x3f800000,
                                                                              CONCAT416(0x3f800000,
                                                                                        CONCAT412(
                                                  0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)
                                                  ))))));
                            fVar243 = (float)local_9c0._0_4_;
                            fVar246 = (float)local_9c0._4_4_;
                            fVar247 = fStack_9b8;
                            fVar248 = fStack_9b4;
                            fVar219 = fStack_9b0;
                            fVar220 = fStack_9ac;
                            fVar221 = fStack_9a8;
                            fVar164 = fStack_9a4;
                          }
                          uVar82 = vptestmd_avx512vl(local_9e0,local_9e0);
                          uVar82 = uVar82 & 0xf;
                          auVar86 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                          bVar9 = (bool)((byte)uVar82 & 1);
                          bVar10 = (bool)((byte)(uVar82 >> 1) & 1);
                          bVar11 = (bool)((byte)(uVar82 >> 2) & 1);
                          bVar12 = SUB81(uVar82 >> 3,0);
                          *(uint *)(local_750.ray + 0x80) =
                               (uint)bVar9 * auVar86._0_4_ |
                               (uint)!bVar9 * *(int *)(local_750.ray + 0x80);
                          *(uint *)(local_750.ray + 0x84) =
                               (uint)bVar10 * auVar86._4_4_ |
                               (uint)!bVar10 * *(int *)(local_750.ray + 0x84);
                          *(uint *)(local_750.ray + 0x88) =
                               (uint)bVar11 * auVar86._8_4_ |
                               (uint)!bVar11 * *(int *)(local_750.ray + 0x88);
                          *(uint *)(local_750.ray + 0x8c) =
                               (uint)bVar12 * auVar86._12_4_ |
                               (uint)!bVar12 * *(int *)(local_750.ray + 0x8c);
                          bVar74 = 1;
                          if ((byte)uVar82 != 0) goto LAB_01dfc618;
                        }
                        *(float *)(ray + k * 4 + 0x80) = fVar232;
                        bVar74 = 0;
                        goto LAB_01dfc618;
                      }
                    }
                    bVar74 = 0;
                    goto LAB_01dfc618;
                  }
                }
                bVar81 = uVar82 < 4;
                uVar82 = uVar82 + 1;
              } while (uVar82 != 5);
              bVar81 = false;
              auVar236 = ZEXT3264(CONCAT428(0x3f800000,
                                            CONCAT424(0x3f800000,
                                                      CONCAT420(0x3f800000,
                                                                CONCAT416(0x3f800000,
                                                                          CONCAT412(0x3f800000,
                                                                                    CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
              bVar74 = 5;
LAB_01dfc618:
              bVar79 = (bool)(bVar79 | bVar81 & bVar74);
              uVar166 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar157._4_4_ = uVar166;
              auVar157._0_4_ = uVar166;
              auVar157._8_4_ = uVar166;
              auVar157._12_4_ = uVar166;
              auVar157._16_4_ = uVar166;
              auVar157._20_4_ = uVar166;
              auVar157._24_4_ = uVar166;
              auVar157._28_4_ = uVar166;
              auVar68._4_4_ = fStack_3bc;
              auVar68._0_4_ = local_3c0;
              auVar68._8_4_ = fStack_3b8;
              auVar68._12_4_ = fStack_3b4;
              auVar68._16_4_ = fStack_3b0;
              auVar68._20_4_ = fStack_3ac;
              auVar68._24_4_ = fStack_3a8;
              auVar68._28_4_ = fStack_3a4;
              uVar16 = vcmpps_avx512vl(auVar157,auVar68,0xd);
              bVar78 = ~('\x01' << ((byte)iVar20 & 0x1f)) & bVar78 & (byte)uVar16;
            } while (bVar78 != 0);
            uVar83 = (ulong)local_9d0;
            auVar99 = local_320;
          }
          auVar242 = ZEXT3264(local_360);
          bVar78 = local_3e0[0] | (byte)uVar83;
          auVar182._0_4_ = fVar243 + auVar99._0_4_;
          auVar182._4_4_ = fVar246 + auVar99._4_4_;
          auVar182._8_4_ = fVar247 + auVar99._8_4_;
          auVar182._12_4_ = fVar248 + auVar99._12_4_;
          auVar182._16_4_ = fVar219 + auVar99._16_4_;
          auVar182._20_4_ = fVar220 + auVar99._20_4_;
          auVar182._24_4_ = fVar221 + auVar99._24_4_;
          auVar182._28_4_ = fVar164 + auVar99._28_4_;
          uVar16 = vcmpps_avx512vl(auVar182,auVar157,2);
          bVar72 = (byte)uVar18 & bVar72 & (byte)uVar16;
          auVar183._8_4_ = 2;
          auVar183._0_8_ = 0x200000002;
          auVar183._12_4_ = 2;
          auVar183._16_4_ = 2;
          auVar183._20_4_ = 2;
          auVar183._24_4_ = 2;
          auVar183._28_4_ = 2;
          auVar36._8_4_ = 3;
          auVar36._0_8_ = 0x300000003;
          auVar36._12_4_ = 3;
          auVar36._16_4_ = 3;
          auVar36._20_4_ = 3;
          auVar36._24_4_ = 3;
          auVar36._28_4_ = 3;
          auVar99 = vpblendmd_avx512vl(auVar183,auVar36);
          auVar133._0_4_ = (uint)(bVar78 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar78 & 1) * 2;
          bVar81 = (bool)(bVar78 >> 1 & 1);
          auVar133._4_4_ = (uint)bVar81 * auVar99._4_4_ | (uint)!bVar81 * 2;
          bVar81 = (bool)(bVar78 >> 2 & 1);
          auVar133._8_4_ = (uint)bVar81 * auVar99._8_4_ | (uint)!bVar81 * 2;
          bVar81 = (bool)(bVar78 >> 3 & 1);
          auVar133._12_4_ = (uint)bVar81 * auVar99._12_4_ | (uint)!bVar81 * 2;
          bVar81 = (bool)(bVar78 >> 4 & 1);
          auVar133._16_4_ = (uint)bVar81 * auVar99._16_4_ | (uint)!bVar81 * 2;
          bVar81 = (bool)(bVar78 >> 5 & 1);
          auVar133._20_4_ = (uint)bVar81 * auVar99._20_4_ | (uint)!bVar81 * 2;
          bVar81 = (bool)(bVar78 >> 6 & 1);
          auVar133._24_4_ = (uint)bVar81 * auVar99._24_4_ | (uint)!bVar81 * 2;
          auVar133._28_4_ = (uint)(bVar78 >> 7) * auVar99._28_4_ | (uint)!(bool)(bVar78 >> 7) * 2;
          uVar16 = vpcmpd_avx512vl(local_380,auVar133,5);
          bVar78 = (byte)uVar16 & bVar72;
          if (bVar78 != 0) {
            local_3e0 = auVar133;
            auVar88 = vminps_avx(local_640._0_16_,local_680._0_16_);
            auVar86 = vmaxps_avx(local_640._0_16_,local_680._0_16_);
            auVar89 = vminps_avx(local_660._0_16_,local_6a0._0_16_);
            auVar93 = vminps_avx(auVar88,auVar89);
            auVar88 = vmaxps_avx(local_660._0_16_,local_6a0._0_16_);
            auVar89 = vmaxps_avx(auVar86,auVar88);
            auVar196._8_4_ = 0x7fffffff;
            auVar196._0_8_ = 0x7fffffff7fffffff;
            auVar196._12_4_ = 0x7fffffff;
            auVar86 = vandps_avx(auVar93,auVar196);
            auVar88 = vandps_avx(auVar89,auVar196);
            auVar86 = vmaxps_avx(auVar86,auVar88);
            auVar88 = vmovshdup_avx(auVar86);
            auVar88 = vmaxss_avx(auVar88,auVar86);
            auVar86 = vshufpd_avx(auVar86,auVar86,1);
            auVar86 = vmaxss_avx(auVar86,auVar88);
            fVar213 = auVar86._0_4_ * 1.9073486e-06;
            local_600 = vshufps_avx(auVar89,auVar89,0xff);
            local_3c0 = fVar243 + local_360._0_4_;
            fStack_3bc = fVar246 + local_360._4_4_;
            fStack_3b8 = fVar247 + local_360._8_4_;
            fStack_3b4 = fVar248 + local_360._12_4_;
            fStack_3b0 = fVar219 + local_360._16_4_;
            fStack_3ac = fVar220 + local_360._20_4_;
            fStack_3a8 = fVar221 + local_360._24_4_;
            fStack_3a4 = fVar164 + local_360._28_4_;
            _local_720 = local_360;
            do {
              auVar158._8_4_ = 0x7f800000;
              auVar158._0_8_ = 0x7f8000007f800000;
              auVar158._12_4_ = 0x7f800000;
              auVar158._16_4_ = 0x7f800000;
              auVar158._20_4_ = 0x7f800000;
              auVar158._24_4_ = 0x7f800000;
              auVar158._28_4_ = 0x7f800000;
              auVar99 = vblendmps_avx512vl(auVar158,auVar242._0_32_);
              auVar134._0_4_ =
                   (uint)(bVar78 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar78 & 1) * 0x7f800000;
              bVar81 = (bool)(bVar78 >> 1 & 1);
              auVar134._4_4_ = (uint)bVar81 * auVar99._4_4_ | (uint)!bVar81 * 0x7f800000;
              bVar81 = (bool)(bVar78 >> 2 & 1);
              auVar134._8_4_ = (uint)bVar81 * auVar99._8_4_ | (uint)!bVar81 * 0x7f800000;
              bVar81 = (bool)(bVar78 >> 3 & 1);
              auVar134._12_4_ = (uint)bVar81 * auVar99._12_4_ | (uint)!bVar81 * 0x7f800000;
              bVar81 = (bool)(bVar78 >> 4 & 1);
              auVar134._16_4_ = (uint)bVar81 * auVar99._16_4_ | (uint)!bVar81 * 0x7f800000;
              bVar81 = (bool)(bVar78 >> 5 & 1);
              auVar134._20_4_ = (uint)bVar81 * auVar99._20_4_ | (uint)!bVar81 * 0x7f800000;
              auVar134._24_4_ =
                   (uint)(bVar78 >> 6) * auVar99._24_4_ | (uint)!(bool)(bVar78 >> 6) * 0x7f800000;
              auVar134._28_4_ = 0x7f800000;
              auVar99 = vshufps_avx(auVar134,auVar134,0xb1);
              auVar99 = vminps_avx(auVar134,auVar99);
              auVar98 = vshufpd_avx(auVar99,auVar99,5);
              auVar99 = vminps_avx(auVar99,auVar98);
              auVar98 = vpermpd_avx2(auVar99,0x4e);
              auVar99 = vminps_avx(auVar99,auVar98);
              uVar16 = vcmpps_avx512vl(auVar134,auVar99,0);
              bVar73 = (byte)uVar16 & bVar78;
              bVar74 = bVar78;
              if (bVar73 != 0) {
                bVar74 = bVar73;
              }
              iVar20 = 0;
              for (uVar85 = (uint)bVar74; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x80000000) {
                iVar20 = iVar20 + 1;
              }
              auVar184 = ZEXT464(*(uint *)(local_200 + (uint)(iVar20 << 2)));
              auVar245 = ZEXT464(*(uint *)(local_340 + (uint)(iVar20 << 2)));
              fVar231 = local_9c4;
              if ((float)local_6c0._0_4_ < 0.0) {
                local_8a0._0_16_ = ZEXT416(*(uint *)(local_200 + (uint)(iVar20 << 2)));
                local_7a0._0_16_ = ZEXT416(*(uint *)(local_340 + (uint)(iVar20 << 2)));
                fVar231 = sqrtf((float)local_6c0._0_4_);
                auVar245 = ZEXT1664(local_7a0._0_16_);
                auVar184 = ZEXT1664(local_8a0._0_16_);
              }
              bVar81 = true;
              uVar82 = 0;
              do {
                local_7a0._0_16_ = auVar245._0_16_;
                uVar166 = auVar245._0_4_;
                auVar150._4_4_ = uVar166;
                auVar150._0_4_ = uVar166;
                auVar150._8_4_ = uVar166;
                auVar150._12_4_ = uVar166;
                auVar86 = vfmadd132ps_fma(auVar150,ZEXT816(0) << 0x40,local_6b0);
                fVar248 = auVar184._0_4_;
                fVar221 = 1.0 - fVar248;
                fVar247 = fVar221 * fVar221 * fVar221;
                fVar243 = fVar248 * fVar248;
                fVar220 = fVar248 * fVar243;
                auVar88 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar247),
                                          ZEXT416((uint)fVar220));
                fVar246 = fVar248 * fVar221;
                auVar223 = ZEXT416((uint)fVar221);
                auVar93 = vfmadd231ss_fma(ZEXT416((uint)(fVar248 * fVar246 * 6.0)),
                                          ZEXT416((uint)(fVar246 * fVar221)),
                                          SUB6416(ZEXT464(0x41400000),0));
                auVar89 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar220),
                                          ZEXT416((uint)fVar247));
                auVar2 = vfmadd231ss_fma(ZEXT416((uint)(fVar246 * fVar221 * 6.0)),
                                         SUB6416(ZEXT464(0x41400000),0),
                                         ZEXT416((uint)(fVar248 * fVar246)));
                fVar247 = fVar247 * 0.16666667;
                fVar248 = (auVar88._0_4_ + auVar93._0_4_) * 0.16666667;
                fVar219 = (auVar89._0_4_ + auVar2._0_4_) * 0.16666667;
                fVar220 = fVar220 * 0.16666667;
                auVar197._0_4_ = fVar220 * (float)local_6a0._0_4_;
                auVar197._4_4_ = fVar220 * (float)local_6a0._4_4_;
                auVar197._8_4_ = fVar220 * fStack_698;
                auVar197._12_4_ = fVar220 * fStack_694;
                auVar226._4_4_ = fVar219;
                auVar226._0_4_ = fVar219;
                auVar226._8_4_ = fVar219;
                auVar226._12_4_ = fVar219;
                auVar88 = vfmadd132ps_fma(auVar226,auVar197,local_660._0_16_);
                auVar198._4_4_ = fVar248;
                auVar198._0_4_ = fVar248;
                auVar198._8_4_ = fVar248;
                auVar198._12_4_ = fVar248;
                auVar88 = vfmadd132ps_fma(auVar198,auVar88,local_680._0_16_);
                auVar174._4_4_ = fVar247;
                auVar174._0_4_ = fVar247;
                auVar174._8_4_ = fVar247;
                auVar174._12_4_ = fVar247;
                auVar88 = vfmadd132ps_fma(auVar174,auVar88,local_640._0_16_);
                local_540._0_16_ = auVar88;
                auVar86 = vsubps_avx(auVar86,auVar88);
                local_6e0._0_16_ = auVar86;
                auVar86 = vdpps_avx(auVar86,auVar86,0x7f);
                local_8a0._0_16_ = auVar184._0_16_;
                local_700._0_16_ = auVar86;
                if (auVar86._0_4_ < 0.0) {
                  local_7c0._0_4_ = fVar243;
                  local_7e0._0_4_ = fVar246;
                  auVar249._0_4_ = sqrtf(auVar86._0_4_);
                  auVar249._4_60_ = extraout_var_01;
                  auVar86 = auVar249._0_16_;
                  fVar246 = (float)local_7e0._0_4_;
                  auVar88 = local_8a0._0_16_;
                }
                else {
                  auVar86 = vsqrtss_avx(auVar86,auVar86);
                  local_7c0._0_4_ = fVar243;
                  auVar88 = auVar184._0_16_;
                }
                local_560._4_4_ = fVar221;
                local_560._0_4_ = fVar221;
                fStack_558 = fVar221;
                fStack_554 = fVar221;
                auVar89 = vfnmsub213ss_fma(auVar88,auVar88,ZEXT416((uint)(fVar246 * 4.0)));
                auVar88 = vfmadd231ss_fma(ZEXT416((uint)(fVar246 * 4.0)),auVar223,auVar223);
                fVar243 = fVar221 * -fVar221 * 0.5;
                fVar246 = auVar89._0_4_ * 0.5;
                fVar247 = auVar88._0_4_ * 0.5;
                local_7c0._0_4_ = (float)local_7c0._0_4_ * 0.5;
                auVar217._0_4_ = (float)local_7c0._0_4_ * (float)local_6a0._0_4_;
                auVar217._4_4_ = (float)local_7c0._0_4_ * (float)local_6a0._4_4_;
                auVar217._8_4_ = (float)local_7c0._0_4_ * fStack_698;
                auVar217._12_4_ = (float)local_7c0._0_4_ * fStack_694;
                auVar175._4_4_ = fVar247;
                auVar175._0_4_ = fVar247;
                auVar175._8_4_ = fVar247;
                auVar175._12_4_ = fVar247;
                auVar88 = vfmadd132ps_fma(auVar175,auVar217,local_660._0_16_);
                auVar199._4_4_ = fVar246;
                auVar199._0_4_ = fVar246;
                auVar199._8_4_ = fVar246;
                auVar199._12_4_ = fVar246;
                auVar88 = vfmadd132ps_fma(auVar199,auVar88,local_680._0_16_);
                auVar255._4_4_ = fVar243;
                auVar255._0_4_ = fVar243;
                auVar255._8_4_ = fVar243;
                auVar255._12_4_ = fVar243;
                _local_7c0 = vfmadd132ps_fma(auVar255,auVar88,local_640._0_16_);
                local_580._0_16_ = vdpps_avx(_local_7c0,_local_7c0,0x7f);
                auVar67._12_4_ = 0;
                auVar67._0_12_ = ZEXT812(0);
                fVar243 = local_580._0_4_;
                auVar88 = vrsqrt14ss_avx512f(auVar67 << 0x20,ZEXT416((uint)fVar243));
                fVar246 = auVar88._0_4_;
                local_5a0._0_16_ = vrcp14ss_avx512f(auVar67 << 0x20,ZEXT416((uint)fVar243));
                auVar88 = vfnmadd213ss_fma(local_5a0._0_16_,local_580._0_16_,ZEXT416(0x40000000));
                local_770._0_4_ = auVar88._0_4_;
                local_7e0._0_4_ = auVar86._0_4_;
                if (fVar243 < -fVar243) {
                  auVar252._0_4_ = sqrtf(fVar243);
                  auVar252._4_60_ = extraout_var_02;
                  auVar86 = ZEXT416((uint)local_7e0._0_4_);
                  auVar89 = auVar252._0_16_;
                  auVar88 = _local_7c0;
                }
                else {
                  auVar89 = vsqrtss_avx512f(local_580._0_16_,local_580._0_16_);
                  auVar88 = _local_7c0;
                }
                fVar243 = fVar246 * 1.5 + fVar243 * -0.5 * fVar246 * fVar246 * fVar246;
                auVar260._0_4_ = auVar88._0_4_ * fVar243;
                auVar260._4_4_ = auVar88._4_4_ * fVar243;
                auVar260._8_4_ = auVar88._8_4_ * fVar243;
                auVar260._12_4_ = auVar88._12_4_ * fVar243;
                auVar93 = vdpps_avx(local_6e0._0_16_,auVar260,0x7f);
                fVar248 = auVar86._0_4_;
                fVar246 = auVar93._0_4_;
                auVar151._0_4_ = fVar246 * fVar246;
                auVar151._4_4_ = auVar93._4_4_ * auVar93._4_4_;
                auVar151._8_4_ = auVar93._8_4_ * auVar93._8_4_;
                auVar151._12_4_ = auVar93._12_4_ * auVar93._12_4_;
                auVar2 = vsubps_avx(local_700._0_16_,auVar151);
                fVar247 = auVar2._0_4_;
                auVar176._4_12_ = ZEXT812(0) << 0x20;
                auVar176._0_4_ = fVar247;
                auVar90 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar176);
                auVar87 = vmulss_avx512f(auVar90,ZEXT416(0x3fc00000));
                if (fVar247 < 0.0) {
                  local_5c0._0_4_ = auVar89._0_4_;
                  local_5f0 = fVar243;
                  fStack_5ec = fVar243;
                  fStack_5e8 = fVar243;
                  fStack_5e4 = fVar243;
                  local_5e0 = auVar260;
                  local_5d0 = auVar90;
                  fVar232 = sqrtf(fVar247);
                  auVar87 = ZEXT416(auVar87._0_4_);
                  auVar89 = ZEXT416((uint)local_5c0._0_4_);
                  auVar86 = ZEXT416((uint)local_7e0._0_4_);
                  auVar88 = _local_7c0;
                  auVar260 = local_5e0;
                  auVar90 = local_5d0;
                  fVar243 = local_5f0;
                  fVar219 = fStack_5ec;
                  fVar220 = fStack_5e8;
                  fVar221 = fStack_5e4;
                }
                else {
                  auVar2 = vsqrtss_avx(auVar2,auVar2);
                  fVar232 = auVar2._0_4_;
                  fVar219 = fVar243;
                  fVar220 = fVar243;
                  fVar221 = fVar243;
                }
                auVar257 = ZEXT1664(auVar88);
                auVar252 = ZEXT1664(local_700._0_16_);
                auVar249 = ZEXT1664(local_6e0._0_16_);
                auVar269 = ZEXT3264(local_8e0);
                auVar261 = ZEXT3264(local_900);
                auVar262 = ZEXT3264(local_920);
                auVar263 = ZEXT3264(local_940);
                auVar264 = ZEXT3264(local_800);
                auVar265 = ZEXT3264(local_960);
                auVar266 = ZEXT3264(local_820);
                auVar267 = ZEXT3264(local_980);
                auVar268 = ZEXT3264(local_840);
                auVar270 = ZEXT3264(local_860);
                auVar271 = ZEXT3264(local_880);
                auVar272 = ZEXT3264(local_8c0);
                auVar273 = ZEXT3264(local_9a0);
                auVar92 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar223,local_8a0._0_16_);
                auVar2 = vfmadd231ss_fma(auVar223,local_8a0._0_16_,SUB6416(ZEXT464(0xc0000000),0));
                fVar144 = local_8a0._0_4_;
                auVar200._0_4_ = fVar144 * (float)local_6a0._0_4_;
                auVar200._4_4_ = fVar144 * (float)local_6a0._4_4_;
                auVar200._8_4_ = fVar144 * fStack_698;
                auVar200._12_4_ = fVar144 * fStack_694;
                auVar218._0_4_ = auVar2._0_4_;
                auVar218._4_4_ = auVar218._0_4_;
                auVar218._8_4_ = auVar218._0_4_;
                auVar218._12_4_ = auVar218._0_4_;
                auVar2 = vfmadd132ps_fma(auVar218,auVar200,local_660._0_16_);
                auVar177._0_4_ = auVar92._0_4_;
                auVar177._4_4_ = auVar177._0_4_;
                auVar177._8_4_ = auVar177._0_4_;
                auVar177._12_4_ = auVar177._0_4_;
                auVar2 = vfmadd132ps_fma(auVar177,auVar2,local_680._0_16_);
                auVar2 = vfmadd132ps_fma(_local_560,auVar2,local_640._0_16_);
                auVar178._0_4_ = auVar2._0_4_ * (float)local_580._0_4_;
                auVar178._4_4_ = auVar2._4_4_ * (float)local_580._0_4_;
                auVar178._8_4_ = auVar2._8_4_ * (float)local_580._0_4_;
                auVar178._12_4_ = auVar2._12_4_ * (float)local_580._0_4_;
                auVar2 = vdpps_avx(auVar88,auVar2,0x7f);
                fVar164 = auVar2._0_4_;
                auVar201._0_4_ = auVar88._0_4_ * fVar164;
                auVar201._4_4_ = auVar88._4_4_ * fVar164;
                auVar201._8_4_ = auVar88._8_4_ * fVar164;
                auVar201._12_4_ = auVar88._12_4_ * fVar164;
                auVar2 = vsubps_avx(auVar178,auVar201);
                fVar164 = (float)local_770._0_4_ * (float)local_5a0._0_4_;
                auVar24._8_4_ = 0x80000000;
                auVar24._0_8_ = 0x8000000080000000;
                auVar24._12_4_ = 0x80000000;
                auVar91 = vxorps_avx512vl(auVar88,auVar24);
                auVar227._0_4_ = fVar243 * auVar2._0_4_ * fVar164;
                auVar227._4_4_ = fVar219 * auVar2._4_4_ * fVar164;
                auVar227._8_4_ = fVar220 * auVar2._8_4_ * fVar164;
                auVar227._12_4_ = fVar221 * auVar2._12_4_ * fVar164;
                auVar2 = vdpps_avx(auVar91,auVar260,0x7f);
                auVar223 = vmaxss_avx(ZEXT416((uint)fVar213),
                                      ZEXT416((uint)((float)local_7a0._0_4_ *
                                                    fVar231 * 1.9073486e-06)));
                auVar92 = vdivss_avx512f(ZEXT416((uint)fVar213),auVar89);
                auVar89 = vdpps_avx(local_6e0._0_16_,auVar227,0x7f);
                auVar86 = vfmadd213ss_fma(auVar86,ZEXT416((uint)fVar213),auVar223);
                auVar92 = vfmadd213ss_fma(ZEXT416((uint)(fVar248 + 1.0)),auVar92,auVar86);
                auVar86 = vdpps_avx(local_6b0,auVar260,0x7f);
                fVar243 = auVar2._0_4_ + auVar89._0_4_;
                auVar89 = vdpps_avx(local_6e0._0_16_,auVar91,0x7f);
                auVar91 = vmulss_avx512f(auVar90,ZEXT416((uint)(fVar247 * -0.5)));
                auVar90 = vmulss_avx512f(auVar90,auVar90);
                auVar2 = vdpps_avx(local_6e0._0_16_,local_6b0,0x7f);
                auVar91 = vaddss_avx512f(auVar87,ZEXT416((uint)(auVar91._0_4_ * auVar90._0_4_)));
                auVar90 = vfnmadd231ss_fma(auVar89,auVar93,ZEXT416((uint)fVar243));
                auVar87 = vfnmadd231ss_fma(auVar2,auVar93,auVar86);
                auVar89 = vpermilps_avx(local_540._0_16_,0xff);
                fVar232 = fVar232 - auVar89._0_4_;
                auVar89 = vshufps_avx(auVar88,auVar88,0xff);
                auVar2 = vfmsub213ss_fma(auVar90,auVar91,auVar89);
                fVar247 = auVar87._0_4_ * auVar91._0_4_;
                auVar90 = vfmsub231ss_fma(ZEXT416((uint)(auVar86._0_4_ * auVar2._0_4_)),
                                          ZEXT416((uint)fVar243),ZEXT416((uint)fVar247));
                fVar248 = auVar90._0_4_;
                fVar144 = fVar144 - (fVar246 * (fVar247 / fVar248) -
                                    fVar232 * (auVar86._0_4_ / fVar248));
                auVar184 = ZEXT464((uint)fVar144);
                fVar233 = (float)local_7a0._0_4_ -
                          (fVar232 * (fVar243 / fVar248) - fVar246 * (auVar2._0_4_ / fVar248));
                auVar245 = ZEXT464((uint)fVar233);
                auVar25._8_4_ = 0x7fffffff;
                auVar25._0_8_ = 0x7fffffff7fffffff;
                auVar25._12_4_ = 0x7fffffff;
                auVar86 = vandps_avx512vl(auVar93,auVar25);
                fVar243 = (float)local_9c0._0_4_;
                fVar246 = (float)local_9c0._4_4_;
                fVar247 = fStack_9b8;
                fVar248 = fStack_9b4;
                fVar219 = fStack_9b0;
                fVar220 = fStack_9ac;
                fVar221 = fStack_9a8;
                fVar164 = fStack_9a4;
                if (auVar86._0_4_ < auVar92._0_4_) {
                  auVar86 = vfmadd231ss_fma(ZEXT416((uint)(auVar92._0_4_ + auVar223._0_4_)),
                                            local_600,ZEXT416(0x36000000));
                  auVar26._8_4_ = 0x7fffffff;
                  auVar26._0_8_ = 0x7fffffff7fffffff;
                  auVar26._12_4_ = 0x7fffffff;
                  auVar93 = vandps_avx512vl(ZEXT416((uint)fVar232),auVar26);
                  if (auVar93._0_4_ < auVar86._0_4_) {
                    fVar233 = fVar233 + (float)local_610._0_4_;
                    auVar236 = ZEXT3264(CONCAT428(0x3f800000,
                                                  CONCAT424(0x3f800000,
                                                            CONCAT420(0x3f800000,
                                                                      CONCAT416(0x3f800000,
                                                                                CONCAT412(0x3f800000
                                                                                          ,CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
                    if (fVar233 < fVar143) {
                      bVar74 = 0;
                      goto LAB_01dfd251;
                    }
                    fVar231 = *(float *)(ray + k * 4 + 0x80);
                    auVar245 = ZEXT464((uint)fVar231);
                    auVar242 = ZEXT3264(_local_720);
                    if (fVar233 <= fVar231) {
                      bVar74 = 0;
                      if ((fVar144 < 0.0) || (1.0 < fVar144)) goto LAB_01dfd25a;
                      auVar202._4_12_ = SUB1612(ZEXT816(0),0);
                      auVar202._0_4_ = local_700._0_4_;
                      auVar86 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar202);
                      fVar232 = auVar86._0_4_;
                      pGVar4 = (context->scene->geometries).items[local_758].ptr;
                      if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                        bVar74 = 0;
                        goto LAB_01dfd25a;
                      }
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (bVar74 = 1, pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_01dfd25a;
                      fVar232 = fVar232 * 1.5 + local_700._0_4_ * -0.5 * fVar232 * fVar232 * fVar232
                      ;
                      auVar203._0_4_ = local_6e0._0_4_ * fVar232;
                      auVar203._4_4_ = local_6e0._4_4_ * fVar232;
                      auVar203._8_4_ = local_6e0._8_4_ * fVar232;
                      auVar203._12_4_ = local_6e0._12_4_ * fVar232;
                      auVar2 = vfmadd213ps_fma(auVar89,auVar203,auVar88);
                      auVar86 = vshufps_avx(auVar203,auVar203,0xc9);
                      auVar89 = vshufps_avx(auVar88,auVar88,0xc9);
                      auVar204._0_4_ = auVar203._0_4_ * auVar89._0_4_;
                      auVar204._4_4_ = auVar203._4_4_ * auVar89._4_4_;
                      auVar204._8_4_ = auVar203._8_4_ * auVar89._8_4_;
                      auVar204._12_4_ = auVar203._12_4_ * auVar89._12_4_;
                      auVar93 = vfmsub231ps_fma(auVar204,auVar88,auVar86);
                      auVar86 = vshufps_avx(auVar93,auVar93,0xc9);
                      auVar89 = vshufps_avx(auVar2,auVar2,0xc9);
                      auVar93 = vshufps_avx(auVar93,auVar93,0xd2);
                      auVar152._0_4_ = auVar2._0_4_ * auVar93._0_4_;
                      auVar152._4_4_ = auVar2._4_4_ * auVar93._4_4_;
                      auVar152._8_4_ = auVar2._8_4_ * auVar93._8_4_;
                      auVar152._12_4_ = auVar2._12_4_ * auVar93._12_4_;
                      auVar86 = vfmsub231ps_fma(auVar152,auVar86,auVar89);
                      local_4e0 = (RTCHitN  [16])vshufps_avx(auVar86,auVar86,0x55);
                      auStack_4d0 = vshufps_avx(auVar86,auVar86,0xaa);
                      local_4c0 = auVar86._0_4_;
                      uStack_4bc = local_4c0;
                      uStack_4b8 = local_4c0;
                      uStack_4b4 = local_4c0;
                      local_4b0 = fVar144;
                      fStack_4ac = fVar144;
                      fStack_4a8 = fVar144;
                      fStack_4a4 = fVar144;
                      local_4a0 = ZEXT416(0) << 0x20;
                      local_490 = local_4f0._0_8_;
                      uStack_488 = local_4f0._8_8_;
                      local_480 = local_500;
                      vpcmpeqd_avx2(ZEXT1632(local_500),ZEXT1632(local_500));
                      uStack_46c = context->user->instID[0];
                      local_470 = uStack_46c;
                      uStack_468 = uStack_46c;
                      uStack_464 = uStack_46c;
                      uStack_460 = context->user->instPrimID[0];
                      uStack_45c = uStack_460;
                      uStack_458 = uStack_460;
                      uStack_454 = uStack_460;
                      *(float *)(ray + k * 4 + 0x80) = fVar233;
                      local_9e0 = local_510;
                      local_750.valid = (int *)local_9e0;
                      local_750.geometryUserPtr = pGVar4->userPtr;
                      local_750.context = context->user;
                      local_750.hit = local_4e0;
                      local_750.N = 4;
                      local_750.ray = (RTCRayN *)ray;
                      if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar249 = ZEXT1664(local_6e0._0_16_);
                        auVar252 = ZEXT1664(local_700._0_16_);
                        auVar257 = ZEXT1664(auVar88);
                        (*pGVar4->occlusionFilterN)(&local_750);
                        auVar242 = ZEXT3264(_local_720);
                        auVar273 = ZEXT3264(local_9a0);
                        auVar272 = ZEXT3264(local_8c0);
                        auVar271 = ZEXT3264(local_880);
                        auVar270 = ZEXT3264(local_860);
                        auVar268 = ZEXT3264(local_840);
                        auVar267 = ZEXT3264(local_980);
                        auVar266 = ZEXT3264(local_820);
                        auVar265 = ZEXT3264(local_960);
                        auVar264 = ZEXT3264(local_800);
                        auVar263 = ZEXT3264(local_940);
                        auVar262 = ZEXT3264(local_920);
                        auVar261 = ZEXT3264(local_900);
                        auVar269 = ZEXT3264(local_8e0);
                        auVar236 = ZEXT3264(CONCAT428(0x3f800000,
                                                      CONCAT424(0x3f800000,
                                                                CONCAT420(0x3f800000,
                                                                          CONCAT416(0x3f800000,
                                                                                    CONCAT412(
                                                  0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)
                                                  ))))));
                        fVar243 = (float)local_9c0._0_4_;
                        fVar246 = (float)local_9c0._4_4_;
                        fVar247 = fStack_9b8;
                        fVar248 = fStack_9b4;
                        fVar219 = fStack_9b0;
                        fVar220 = fStack_9ac;
                        fVar221 = fStack_9a8;
                        fVar164 = fStack_9a4;
                      }
                      uVar82 = vptestmd_avx512vl(local_9e0,local_9e0);
                      if ((uVar82 & 0xf) != 0) {
                        p_Var8 = context->args->filter;
                        if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar249 = ZEXT1664(auVar249._0_16_);
                          auVar252 = ZEXT1664(auVar252._0_16_);
                          auVar257 = ZEXT1664(auVar257._0_16_);
                          (*p_Var8)(&local_750);
                          auVar242 = ZEXT3264(_local_720);
                          auVar273 = ZEXT3264(local_9a0);
                          auVar272 = ZEXT3264(local_8c0);
                          auVar271 = ZEXT3264(local_880);
                          auVar270 = ZEXT3264(local_860);
                          auVar268 = ZEXT3264(local_840);
                          auVar267 = ZEXT3264(local_980);
                          auVar266 = ZEXT3264(local_820);
                          auVar265 = ZEXT3264(local_960);
                          auVar264 = ZEXT3264(local_800);
                          auVar263 = ZEXT3264(local_940);
                          auVar262 = ZEXT3264(local_920);
                          auVar261 = ZEXT3264(local_900);
                          auVar269 = ZEXT3264(local_8e0);
                          auVar236 = ZEXT3264(CONCAT428(0x3f800000,
                                                        CONCAT424(0x3f800000,
                                                                  CONCAT420(0x3f800000,
                                                                            CONCAT416(0x3f800000,
                                                                                      CONCAT412(
                                                  0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)
                                                  ))))));
                          fVar243 = (float)local_9c0._0_4_;
                          fVar246 = (float)local_9c0._4_4_;
                          fVar247 = fStack_9b8;
                          fVar248 = fStack_9b4;
                          fVar219 = fStack_9b0;
                          fVar220 = fStack_9ac;
                          fVar221 = fStack_9a8;
                          fVar164 = fStack_9a4;
                        }
                        auVar245 = ZEXT464((uint)fVar231);
                        uVar82 = vptestmd_avx512vl(local_9e0,local_9e0);
                        uVar82 = uVar82 & 0xf;
                        auVar86 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar9 = (bool)((byte)uVar82 & 1);
                        auVar94._0_4_ =
                             (uint)bVar9 * auVar86._0_4_ |
                             (uint)!bVar9 * *(int *)(local_750.ray + 0x80);
                        bVar9 = (bool)((byte)(uVar82 >> 1) & 1);
                        auVar94._4_4_ =
                             (uint)bVar9 * auVar86._4_4_ |
                             (uint)!bVar9 * *(int *)(local_750.ray + 0x84);
                        bVar9 = (bool)((byte)(uVar82 >> 2) & 1);
                        auVar94._8_4_ =
                             (uint)bVar9 * auVar86._8_4_ |
                             (uint)!bVar9 * *(int *)(local_750.ray + 0x88);
                        bVar9 = SUB81(uVar82 >> 3,0);
                        auVar94._12_4_ =
                             (uint)bVar9 * auVar86._12_4_ |
                             (uint)!bVar9 * *(int *)(local_750.ray + 0x8c);
                        *(undefined1 (*) [16])(local_750.ray + 0x80) = auVar94;
                        bVar74 = 1;
                        if ((byte)uVar82 != 0) goto LAB_01dfd25a;
                      }
                      *(float *)(ray + k * 4 + 0x80) = fVar231;
                    }
                    auVar245 = ZEXT464((uint)fVar231);
                    bVar74 = 0;
                    goto LAB_01dfd25a;
                  }
                }
                bVar81 = uVar82 < 4;
                uVar82 = uVar82 + 1;
              } while (uVar82 != 5);
              bVar81 = false;
              auVar236 = ZEXT3264(CONCAT428(0x3f800000,
                                            CONCAT424(0x3f800000,
                                                      CONCAT420(0x3f800000,
                                                                CONCAT416(0x3f800000,
                                                                          CONCAT412(0x3f800000,
                                                                                    CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
              bVar74 = 5;
LAB_01dfd251:
              auVar242 = ZEXT3264(_local_720);
LAB_01dfd25a:
              bVar79 = (bool)(bVar79 | bVar81 & bVar74);
              uVar166 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar157._4_4_ = uVar166;
              auVar157._0_4_ = uVar166;
              auVar157._8_4_ = uVar166;
              auVar157._12_4_ = uVar166;
              auVar157._16_4_ = uVar166;
              auVar157._20_4_ = uVar166;
              auVar157._24_4_ = uVar166;
              auVar157._28_4_ = uVar166;
              auVar69._4_4_ = fStack_3bc;
              auVar69._0_4_ = local_3c0;
              auVar69._8_4_ = fStack_3b8;
              auVar69._12_4_ = fStack_3b4;
              auVar69._16_4_ = fStack_3b0;
              auVar69._20_4_ = fStack_3ac;
              auVar69._24_4_ = fStack_3a8;
              auVar69._28_4_ = fStack_3a4;
              uVar16 = vcmpps_avx512vl(auVar157,auVar69,0xd);
              bVar78 = ~('\x01' << ((byte)iVar20 & 0x1f)) & bVar78 & (byte)uVar16;
            } while (bVar78 != 0);
            auVar242 = ZEXT3264(local_360);
            auVar133 = local_3e0;
          }
          uVar18 = vpcmpgtd_avx512vl(auVar133,local_380);
          uVar19 = vpcmpd_avx512vl(local_380,local_300,1);
          auVar208._0_4_ = fVar243 + (float)local_1c0._0_4_;
          auVar208._4_4_ = fVar246 + (float)local_1c0._4_4_;
          auVar208._8_4_ = fVar247 + fStack_1b8;
          auVar208._12_4_ = fVar248 + fStack_1b4;
          auVar208._16_4_ = fVar219 + fStack_1b0;
          auVar208._20_4_ = fVar220 + fStack_1ac;
          auVar208._24_4_ = fVar221 + fStack_1a8;
          auVar208._28_4_ = fVar164 + fStack_1a4;
          uVar16 = vcmpps_avx512vl(auVar208,auVar157,2);
          bVar76 = bVar76 & (byte)uVar19 & (byte)uVar16;
          auVar209._0_4_ = fVar243 + auVar242._0_4_;
          auVar209._4_4_ = fVar246 + auVar242._4_4_;
          auVar209._8_4_ = fVar247 + auVar242._8_4_;
          auVar209._12_4_ = fVar248 + auVar242._12_4_;
          auVar209._16_4_ = fVar219 + auVar242._16_4_;
          auVar209._20_4_ = fVar220 + auVar242._20_4_;
          auVar209._24_4_ = fVar221 + auVar242._24_4_;
          auVar209._28_4_ = fVar164 + auVar242._28_4_;
          uVar16 = vcmpps_avx512vl(auVar209,auVar157,2);
          bVar72 = bVar72 & (byte)uVar18 & (byte)uVar16 | bVar76;
          if (bVar72 != 0) {
            uVar83 = (ulong)uVar77;
            abStack_180[uVar83 * 0x60] = bVar72;
            auVar135._0_4_ =
                 (uint)(bVar76 & 1) * local_1c0._0_4_ |
                 (uint)!(bool)(bVar76 & 1) * (int)auVar242._0_4_;
            bVar81 = (bool)(bVar76 >> 1 & 1);
            auVar135._4_4_ = (uint)bVar81 * local_1c0._4_4_ | (uint)!bVar81 * (int)auVar242._4_4_;
            bVar81 = (bool)(bVar76 >> 2 & 1);
            auVar135._8_4_ = (uint)bVar81 * (int)fStack_1b8 | (uint)!bVar81 * (int)auVar242._8_4_;
            bVar81 = (bool)(bVar76 >> 3 & 1);
            auVar135._12_4_ = (uint)bVar81 * (int)fStack_1b4 | (uint)!bVar81 * (int)auVar242._12_4_;
            bVar81 = (bool)(bVar76 >> 4 & 1);
            auVar135._16_4_ = (uint)bVar81 * (int)fStack_1b0 | (uint)!bVar81 * (int)auVar242._16_4_;
            bVar81 = (bool)(bVar76 >> 5 & 1);
            auVar135._20_4_ = (uint)bVar81 * (int)fStack_1ac | (uint)!bVar81 * (int)auVar242._20_4_;
            auVar135._24_4_ =
                 (uint)(bVar76 >> 6) * (int)fStack_1a8 |
                 (uint)!(bool)(bVar76 >> 6) * (int)auVar242._24_4_;
            auVar135._28_4_ = auVar242._28_4_;
            auVar242 = ZEXT3264(auVar135);
            *(undefined1 (*) [32])(auStack_160 + uVar83 * 0x60) = auVar135;
            uVar82 = vmovlps_avx(local_390);
            (&uStack_140)[uVar83 * 0xc] = uVar82;
            aiStack_138[uVar83 * 0x18] = local_9cc + 1;
            uVar77 = uVar77 + 1;
          }
        }
      }
    }
    do {
      uVar85 = uVar77;
      uVar84 = uVar85 - 1;
      if (uVar85 == 0) {
        if (bVar79 != false) {
          return bVar79;
        }
        uVar166 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar38._4_4_ = uVar166;
        auVar38._0_4_ = uVar166;
        auVar38._8_4_ = uVar166;
        auVar38._12_4_ = uVar166;
        auVar38._16_4_ = uVar166;
        auVar38._20_4_ = uVar166;
        auVar38._24_4_ = uVar166;
        auVar38._28_4_ = uVar166;
        uVar16 = vcmpps_avx512vl(local_2e0,auVar38,2);
        uVar77 = (uint)uVar16 & (uint)local_5a8 - 1 & (uint)local_5a8;
        local_5a8 = (ulong)uVar77;
        if (uVar77 == 0) {
          return false;
        }
        goto LAB_01dfad2a;
      }
      uVar82 = (ulong)uVar84;
      lVar75 = uVar82 * 0x60;
      auVar99 = *(undefined1 (*) [32])(auStack_160 + lVar75);
      auVar180._0_4_ = fVar243 + auVar99._0_4_;
      auVar180._4_4_ = fVar246 + auVar99._4_4_;
      auVar180._8_4_ = fVar247 + auVar99._8_4_;
      auVar180._12_4_ = fVar248 + auVar99._12_4_;
      auVar180._16_4_ = fVar219 + auVar99._16_4_;
      auVar180._20_4_ = fVar220 + auVar99._20_4_;
      auVar180._24_4_ = fVar221 + auVar99._24_4_;
      auVar180._28_4_ = fVar164 + auVar99._28_4_;
      uVar166 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar37._4_4_ = uVar166;
      auVar37._0_4_ = uVar166;
      auVar37._8_4_ = uVar166;
      auVar37._12_4_ = uVar166;
      auVar37._16_4_ = uVar166;
      auVar37._20_4_ = uVar166;
      auVar37._24_4_ = uVar166;
      auVar37._28_4_ = uVar166;
      uVar16 = vcmpps_avx512vl(auVar180,auVar37,2);
      uVar136 = (uint)uVar16 & (uint)abStack_180[lVar75];
      uVar77 = uVar84;
    } while (uVar136 == 0);
    uVar83 = (&uStack_140)[uVar82 * 0xc];
    auVar168._8_8_ = 0;
    auVar168._0_8_ = uVar83;
    auVar207._8_4_ = 0x7f800000;
    auVar207._0_8_ = 0x7f8000007f800000;
    auVar207._12_4_ = 0x7f800000;
    auVar207._16_4_ = 0x7f800000;
    auVar207._20_4_ = 0x7f800000;
    auVar207._24_4_ = 0x7f800000;
    auVar207._28_4_ = 0x7f800000;
    auVar98 = vblendmps_avx512vl(auVar207,auVar99);
    bVar72 = (byte)uVar136;
    auVar131._0_4_ =
         (uint)(bVar72 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar72 & 1) * (int)auVar99._0_4_;
    bVar81 = (bool)((byte)(uVar136 >> 1) & 1);
    auVar131._4_4_ = (uint)bVar81 * auVar98._4_4_ | (uint)!bVar81 * (int)auVar99._4_4_;
    bVar81 = (bool)((byte)(uVar136 >> 2) & 1);
    auVar131._8_4_ = (uint)bVar81 * auVar98._8_4_ | (uint)!bVar81 * (int)auVar99._8_4_;
    bVar81 = (bool)((byte)(uVar136 >> 3) & 1);
    auVar131._12_4_ = (uint)bVar81 * auVar98._12_4_ | (uint)!bVar81 * (int)auVar99._12_4_;
    bVar81 = (bool)((byte)(uVar136 >> 4) & 1);
    auVar131._16_4_ = (uint)bVar81 * auVar98._16_4_ | (uint)!bVar81 * (int)auVar99._16_4_;
    bVar81 = (bool)((byte)(uVar136 >> 5) & 1);
    auVar131._20_4_ = (uint)bVar81 * auVar98._20_4_ | (uint)!bVar81 * (int)auVar99._20_4_;
    bVar81 = (bool)((byte)(uVar136 >> 6) & 1);
    auVar131._24_4_ = (uint)bVar81 * auVar98._24_4_ | (uint)!bVar81 * (int)auVar99._24_4_;
    auVar131._28_4_ =
         (uVar136 >> 7) * auVar98._28_4_ | (uint)!SUB41(uVar136 >> 7,0) * (int)auVar99._28_4_;
    auVar99 = vshufps_avx(auVar131,auVar131,0xb1);
    auVar99 = vminps_avx(auVar131,auVar99);
    auVar98 = vshufpd_avx(auVar99,auVar99,5);
    auVar99 = vminps_avx(auVar99,auVar98);
    auVar98 = vpermpd_avx2(auVar99,0x4e);
    auVar99 = vminps_avx(auVar99,auVar98);
    uVar16 = vcmpps_avx512vl(auVar131,auVar99,0);
    bVar76 = (byte)uVar16 & bVar72;
    if (bVar76 != 0) {
      uVar136 = (uint)bVar76;
    }
    uVar137 = 0;
    for (; (uVar136 & 1) == 0; uVar136 = uVar136 >> 1 | 0x80000000) {
      uVar137 = uVar137 + 1;
    }
    local_9cc = aiStack_138[uVar82 * 0x18];
    bVar72 = ~('\x01' << ((byte)uVar137 & 0x1f)) & bVar72;
    abStack_180[lVar75] = bVar72;
    uVar77 = uVar85;
    if (bVar72 == 0) {
      uVar77 = uVar84;
    }
    uVar166 = (undefined4)uVar83;
    auVar154._4_4_ = uVar166;
    auVar154._0_4_ = uVar166;
    auVar154._8_4_ = uVar166;
    auVar154._12_4_ = uVar166;
    auVar154._16_4_ = uVar166;
    auVar154._20_4_ = uVar166;
    auVar154._24_4_ = uVar166;
    auVar154._28_4_ = uVar166;
    auVar86 = vmovshdup_avx(auVar168);
    auVar86 = vsubps_avx(auVar86,auVar168);
    auVar181._0_4_ = auVar86._0_4_;
    auVar181._4_4_ = auVar181._0_4_;
    auVar181._8_4_ = auVar181._0_4_;
    auVar181._12_4_ = auVar181._0_4_;
    auVar181._16_4_ = auVar181._0_4_;
    auVar181._20_4_ = auVar181._0_4_;
    auVar181._24_4_ = auVar181._0_4_;
    auVar181._28_4_ = auVar181._0_4_;
    auVar86 = vfmadd132ps_fma(auVar181,auVar154,_DAT_01faff20);
    _local_4e0 = ZEXT1632(auVar86);
    auVar184 = ZEXT864(*(ulong *)(local_4e0 + (ulong)uVar137 * 4));
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }